

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value-types.cc
# Opt level: O0

bool tinyusdz::value::Lerp(Value *a,Value *b,double dt,Value *dst)

{
  bool bVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  half3 hVar5;
  color3h cVar6;
  point3h pVar7;
  normal3h nVar8;
  vector3h vVar9;
  texcoord3h tVar10;
  half *a_00;
  vector<tinyusdz::value::half,_std::allocator<tinyusdz::value::half>_> *a_01;
  array<tinyusdz::value::half,_2UL> *a_02;
  tinyusdz *ptVar11;
  array<tinyusdz::value::half,_3UL> *a_03;
  array<tinyusdz::value::half,_4UL> *a_04;
  vector<float,_std::allocator<float>_> *a_05;
  array<float,_2UL> *a_06;
  array<float,_3UL> *a_07;
  array<float,_4UL> *a_08;
  vector<double,_std::allocator<double>_> *a_09;
  array<double,_2UL> *a_10;
  quath *a_11;
  vector<tinyusdz::value::quath,_std::allocator<tinyusdz::value::quath>_> *a_12;
  quatf *a_13;
  vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_> *a_14;
  quatd *a_15;
  vector<tinyusdz::value::quatd,_std::allocator<tinyusdz::value::quatd>_> *a_16;
  color3h *a_17;
  vector<tinyusdz::value::color3h,_std::allocator<tinyusdz::value::color3h>_> *a_18;
  color3f *a_19;
  vector<tinyusdz::value::color3f,_std::allocator<tinyusdz::value::color3f>_> *a_20;
  color3d *a_21;
  vector<tinyusdz::value::color3d,_std::allocator<tinyusdz::value::color3d>_> *a_22;
  color4h *a_23;
  vector<tinyusdz::value::color4h,_std::allocator<tinyusdz::value::color4h>_> *a_24;
  color4f *a_25;
  vector<tinyusdz::value::color4f,_std::allocator<tinyusdz::value::color4f>_> *a_26;
  color4d *a_27;
  vector<tinyusdz::value::color4d,_std::allocator<tinyusdz::value::color4d>_> *a_28;
  point3h *a_29;
  vector<tinyusdz::value::point3h,_std::allocator<tinyusdz::value::point3h>_> *a_30;
  point3f *a_31;
  vector<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_> *a_32;
  point3d *a_33;
  vector<tinyusdz::value::point3d,_std::allocator<tinyusdz::value::point3d>_> *a_34;
  normal3h *a_35;
  vector<tinyusdz::value::normal3h,_std::allocator<tinyusdz::value::normal3h>_> *a_36;
  normal3f *a_37;
  vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_> *a_38;
  normal3d *a_39;
  vector<tinyusdz::value::normal3d,_std::allocator<tinyusdz::value::normal3d>_> *a_40;
  vector3h *a_41;
  vector<tinyusdz::value::vector3h,_std::allocator<tinyusdz::value::vector3h>_> *a_42;
  vector3f *a_43;
  vector<tinyusdz::value::vector3f,_std::allocator<tinyusdz::value::vector3f>_> *a_44;
  vector3d *a_45;
  vector<tinyusdz::value::vector3d,_std::allocator<tinyusdz::value::vector3d>_> *a_46;
  texcoord2h *a_47;
  vector<tinyusdz::value::texcoord2h,_std::allocator<tinyusdz::value::texcoord2h>_> *a_48;
  texcoord2f *a_49;
  vector<tinyusdz::value::texcoord2f,_std::allocator<tinyusdz::value::texcoord2f>_> *a_50;
  texcoord2d *a_51;
  vector<tinyusdz::value::texcoord2d,_std::allocator<tinyusdz::value::texcoord2d>_> *a_52;
  texcoord3h *a_53;
  vector<tinyusdz::value::texcoord3h,_std::allocator<tinyusdz::value::texcoord3h>_> *a_54;
  texcoord3f *a_55;
  vector<tinyusdz::value::texcoord3f,_std::allocator<tinyusdz::value::texcoord3f>_> *a_56;
  texcoord3d *a_57;
  vector<tinyusdz::value::texcoord3d,_std::allocator<tinyusdz::value::texcoord3d>_> *a_58;
  vector<std::array<tinyusdz::value::half,_2UL>,_std::allocator<std::array<tinyusdz::value::half,_2UL>_>_>
  *b_00;
  vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
  *b_01;
  vector<std::array<tinyusdz::value::half,_4UL>,_std::allocator<std::array<tinyusdz::value::half,_4UL>_>_>
  *b_02;
  vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_> *b_03;
  vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_> *b_04;
  vector<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_> *b_05;
  vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_> *b_06;
  double3 *b_07;
  vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_> *b_08;
  double4 *b_09;
  vector<std::array<double,_4UL>,_std::allocator<std::array<double,_4UL>_>_> *b_10;
  float3 fVar12;
  color3f cVar13;
  point3f pVar14;
  normal3f nVar15;
  vector3f vVar16;
  texcoord3f tVar17;
  float4 fVar18;
  double2 dVar19;
  quatf qVar20;
  color4f cVar21;
  texcoord2d tVar22;
  vector<tinyusdz::value::texcoord3d,_std::allocator<tinyusdz::value::texcoord3d>_> local_fd8;
  undefined1 local_fc0 [8];
  vector<tinyusdz::value::texcoord3d,_std::allocator<tinyusdz::value::texcoord3d>_> c_71;
  vector<tinyusdz::value::texcoord3d,_std::allocator<tinyusdz::value::texcoord3d>_> *v1_71;
  vector<tinyusdz::value::texcoord3d,_std::allocator<tinyusdz::value::texcoord3d>_> *v0_71;
  double local_f90;
  double local_f88;
  undefined1 local_f80 [8];
  texcoord3d c_70;
  texcoord3d *v1_70;
  texcoord3d *v0_70;
  undefined1 local_f40 [8];
  vector<tinyusdz::value::texcoord3f,_std::allocator<tinyusdz::value::texcoord3f>_> c_69;
  vector<tinyusdz::value::texcoord3f,_std::allocator<tinyusdz::value::texcoord3f>_> *v1_69;
  vector<tinyusdz::value::texcoord3f,_std::allocator<tinyusdz::value::texcoord3f>_> *v0_69;
  float local_f10;
  vector<tinyusdz::value::texcoord3f,_std::allocator<tinyusdz::value::texcoord3f>_> *local_efc;
  texcoord3f c_68;
  texcoord3f *v1_68;
  texcoord3f *v0_68;
  undefined1 local_ec8 [8];
  vector<tinyusdz::value::texcoord3h,_std::allocator<tinyusdz::value::texcoord3h>_> c_67;
  vector<tinyusdz::value::texcoord3h,_std::allocator<tinyusdz::value::texcoord3h>_> *v1_67;
  vector<tinyusdz::value::texcoord3h,_std::allocator<tinyusdz::value::texcoord3h>_> *v0_67;
  texcoord3h local_e96;
  texcoord3h *ptStack_e90;
  texcoord3h c_66;
  texcoord3h *v1_66;
  texcoord3h *v0_66;
  undefined1 local_e68 [8];
  vector<tinyusdz::value::texcoord2d,_std::allocator<tinyusdz::value::texcoord2d>_> c_65;
  vector<tinyusdz::value::texcoord2d,_std::allocator<tinyusdz::value::texcoord2d>_> *v1_65;
  vector<tinyusdz::value::texcoord2d,_std::allocator<tinyusdz::value::texcoord2d>_> *v0_65;
  double local_e38;
  undefined1 local_e30 [8];
  texcoord2d c_64;
  texcoord2d *v1_64;
  texcoord2d *v0_64;
  undefined1 local_df8 [8];
  vector<tinyusdz::value::texcoord2f,_std::allocator<tinyusdz::value::texcoord2f>_> c_63;
  vector<tinyusdz::value::texcoord2f,_std::allocator<tinyusdz::value::texcoord2f>_> *v1_63;
  vector<tinyusdz::value::texcoord2f,_std::allocator<tinyusdz::value::texcoord2f>_> *v0_63;
  texcoord2f local_dc8;
  texcoord2f c_62;
  texcoord2f *v1_62;
  texcoord2f *v0_62;
  undefined1 local_d98 [8];
  vector<tinyusdz::value::texcoord2h,_std::allocator<tinyusdz::value::texcoord2h>_> c_61;
  vector<tinyusdz::value::texcoord2h,_std::allocator<tinyusdz::value::texcoord2h>_> *v1_61;
  vector<tinyusdz::value::texcoord2h,_std::allocator<tinyusdz::value::texcoord2h>_> *v0_61;
  texcoord2h *ptStack_d68;
  texcoord2h c_60;
  texcoord2h *v1_60;
  texcoord2h *v0_60;
  undefined1 local_d40 [8];
  vector<tinyusdz::value::vector3d,_std::allocator<tinyusdz::value::vector3d>_> c_59;
  vector<tinyusdz::value::vector3d,_std::allocator<tinyusdz::value::vector3d>_> *v1_59;
  vector<tinyusdz::value::vector3d,_std::allocator<tinyusdz::value::vector3d>_> *v0_59;
  double local_d10;
  double local_d08;
  undefined1 local_d00 [8];
  vector3d c_58;
  vector3d *v1_58;
  vector3d *v0_58;
  undefined1 local_cc0 [8];
  vector<tinyusdz::value::vector3f,_std::allocator<tinyusdz::value::vector3f>_> c_57;
  vector<tinyusdz::value::vector3f,_std::allocator<tinyusdz::value::vector3f>_> *v1_57;
  vector<tinyusdz::value::vector3f,_std::allocator<tinyusdz::value::vector3f>_> *v0_57;
  float local_c90;
  vector<tinyusdz::value::vector3f,_std::allocator<tinyusdz::value::vector3f>_> *local_c7c;
  vector3f c_56;
  vector3f *v1_56;
  vector3f *v0_56;
  undefined1 local_c48 [8];
  vector<tinyusdz::value::vector3h,_std::allocator<tinyusdz::value::vector3h>_> c_55;
  vector<tinyusdz::value::vector3h,_std::allocator<tinyusdz::value::vector3h>_> *v1_55;
  vector<tinyusdz::value::vector3h,_std::allocator<tinyusdz::value::vector3h>_> *v0_55;
  vector3h local_c16;
  vector3h *pvStack_c10;
  vector3h c_54;
  vector3h *v1_54;
  vector3h *v0_54;
  undefined1 local_be8 [8];
  vector<tinyusdz::value::normal3d,_std::allocator<tinyusdz::value::normal3d>_> c_53;
  vector<tinyusdz::value::normal3d,_std::allocator<tinyusdz::value::normal3d>_> *v1_53;
  vector<tinyusdz::value::normal3d,_std::allocator<tinyusdz::value::normal3d>_> *v0_53;
  double local_bb8;
  double local_bb0;
  undefined1 local_ba8 [8];
  normal3d c_52;
  normal3d *v1_52;
  normal3d *v0_52;
  undefined1 local_b68 [8];
  vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_> c_51;
  vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_> *v1_51;
  vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_> *v0_51;
  float local_b38;
  vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_> *local_b24;
  normal3f c_50;
  normal3f *v1_50;
  normal3f *v0_50;
  undefined1 local_af0 [8];
  vector<tinyusdz::value::normal3h,_std::allocator<tinyusdz::value::normal3h>_> c_49;
  vector<tinyusdz::value::normal3h,_std::allocator<tinyusdz::value::normal3h>_> *v1_49;
  vector<tinyusdz::value::normal3h,_std::allocator<tinyusdz::value::normal3h>_> *v0_49;
  normal3h local_abe;
  normal3h *pnStack_ab8;
  normal3h c_48;
  normal3h *v1_48;
  normal3h *v0_48;
  undefined1 local_a90 [8];
  vector<tinyusdz::value::point3d,_std::allocator<tinyusdz::value::point3d>_> c_47;
  vector<tinyusdz::value::point3d,_std::allocator<tinyusdz::value::point3d>_> *v1_47;
  vector<tinyusdz::value::point3d,_std::allocator<tinyusdz::value::point3d>_> *v0_47;
  double local_a60;
  double local_a58;
  undefined1 local_a50 [8];
  point3d c_46;
  point3d *v1_46;
  point3d *v0_46;
  undefined1 local_a10 [8];
  vector<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_> c_45;
  vector<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_> *v1_45;
  vector<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_> *v0_45;
  float local_9e0;
  vector<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_> *local_9cc;
  point3f c_44;
  point3f *v1_44;
  point3f *v0_44;
  undefined1 local_998 [8];
  vector<tinyusdz::value::point3h,_std::allocator<tinyusdz::value::point3h>_> c_43;
  vector<tinyusdz::value::point3h,_std::allocator<tinyusdz::value::point3h>_> *v1_43;
  vector<tinyusdz::value::point3h,_std::allocator<tinyusdz::value::point3h>_> *v0_43;
  point3h local_966;
  point3h *ppStack_960;
  point3h c_42;
  point3h *v1_42;
  point3h *v0_42;
  undefined1 local_938 [8];
  vector<tinyusdz::value::color4d,_std::allocator<tinyusdz::value::color4d>_> c_41;
  vector<tinyusdz::value::color4d,_std::allocator<tinyusdz::value::color4d>_> *v1_41;
  vector<tinyusdz::value::color4d,_std::allocator<tinyusdz::value::color4d>_> *v0_41;
  double local_908;
  double local_900;
  double local_8f8;
  undefined1 local_8f0 [8];
  color4d c_40;
  color4d *v1_40;
  color4d *v0_40;
  undefined1 local_8a8 [8];
  vector<tinyusdz::value::color4f,_std::allocator<tinyusdz::value::color4f>_> c_39;
  vector<tinyusdz::value::color4f,_std::allocator<tinyusdz::value::color4f>_> *v1_39;
  vector<tinyusdz::value::color4f,_std::allocator<tinyusdz::value::color4f>_> *v0_39;
  undefined1 local_878 [8];
  undefined1 local_870 [8];
  color4f c_38;
  color4f *v1_38;
  color4f *v0_38;
  undefined1 local_838 [8];
  vector<tinyusdz::value::color4h,_std::allocator<tinyusdz::value::color4h>_> c_37;
  vector<tinyusdz::value::color4h,_std::allocator<tinyusdz::value::color4h>_> *v1_37;
  vector<tinyusdz::value::color4h,_std::allocator<tinyusdz::value::color4h>_> *v0_37;
  color4h local_808;
  color4h c_36;
  color4h *v1_36;
  color4h *v0_36;
  undefined1 local_7d8 [8];
  vector<tinyusdz::value::color3d,_std::allocator<tinyusdz::value::color3d>_> c_35;
  vector<tinyusdz::value::color3d,_std::allocator<tinyusdz::value::color3d>_> *v1_35;
  vector<tinyusdz::value::color3d,_std::allocator<tinyusdz::value::color3d>_> *v0_35;
  double local_7a8;
  double local_7a0;
  undefined1 local_798 [8];
  color3d c_34;
  color3d *v1_34;
  color3d *v0_34;
  undefined1 local_758 [8];
  vector<tinyusdz::value::color3f,_std::allocator<tinyusdz::value::color3f>_> c_33;
  vector<tinyusdz::value::color3f,_std::allocator<tinyusdz::value::color3f>_> *v1_33;
  vector<tinyusdz::value::color3f,_std::allocator<tinyusdz::value::color3f>_> *v0_33;
  float local_728;
  vector<tinyusdz::value::color3f,_std::allocator<tinyusdz::value::color3f>_> *local_714;
  color3f c_32;
  color3f *v1_32;
  color3f *v0_32;
  undefined1 local_6e0 [8];
  vector<tinyusdz::value::color3h,_std::allocator<tinyusdz::value::color3h>_> c_31;
  vector<tinyusdz::value::color3h,_std::allocator<tinyusdz::value::color3h>_> *v1_31;
  vector<tinyusdz::value::color3h,_std::allocator<tinyusdz::value::color3h>_> *v0_31;
  color3h local_6ae;
  color3h *pcStack_6a8;
  color3h c_30;
  color3h *v1_30;
  color3h *v0_30;
  undefined1 local_680 [8];
  vector<tinyusdz::value::quatd,_std::allocator<tinyusdz::value::quatd>_> c_29;
  vector<tinyusdz::value::quatd,_std::allocator<tinyusdz::value::quatd>_> *v1_29;
  vector<tinyusdz::value::quatd,_std::allocator<tinyusdz::value::quatd>_> *v0_29;
  double local_650;
  double local_648;
  double local_640;
  undefined1 local_638 [8];
  quatd c_28;
  quatd *v1_28;
  quatd *v0_28;
  undefined1 local_5f0 [8];
  vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_> c_27;
  vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_> *v1_27;
  vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_> *v0_27;
  float local_5c0 [2];
  vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_> *local_5b8;
  quatf c_26;
  quatf *v1_26;
  quatf *v0_26;
  undefined1 local_580 [8];
  vector<tinyusdz::value::quath,_std::allocator<tinyusdz::value::quath>_> c_25;
  vector<tinyusdz::value::quath,_std::allocator<tinyusdz::value::quath>_> *v1_25;
  vector<tinyusdz::value::quath,_std::allocator<tinyusdz::value::quath>_> *v0_25;
  quath local_550;
  quath c_24;
  quath *v1_24;
  quath *v0_24;
  undefined1 local_520 [8];
  vector<std::array<double,_4UL>,_std::allocator<std::array<double,_4UL>_>_> c_23;
  vector<std::array<double,_4UL>,_std::allocator<std::array<double,_4UL>_>_> *v1_23;
  vector<std::array<double,_4UL>,_std::allocator<std::array<double,_4UL>_>_> *v0_23;
  double local_4f0;
  double local_4e8;
  double local_4e0;
  undefined1 local_4d8 [8];
  double4 c_22;
  double4 *v1_22;
  double4 *v0_22;
  undefined1 local_490 [8];
  vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_> c_21;
  vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_> *v1_21;
  vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_> *v0_21;
  double local_460;
  double local_458;
  undefined1 local_450 [8];
  double3 c_20;
  double3 *v1_20;
  double3 *v0_20;
  undefined1 local_410 [8];
  vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_> c_19;
  vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_> *v1_19;
  vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_> *v0_19;
  double local_3e0;
  undefined1 local_3d8 [8];
  double2 c_18;
  double2 *v1_18;
  double2 *v0_18;
  undefined1 local_3a0 [8];
  vector<double,_std::allocator<double>_> c_17;
  vector<double,_std::allocator<double>_> *v1_17;
  vector<double,_std::allocator<double>_> *v0_17;
  double c_16;
  double *v1_16;
  double *v0_16;
  undefined1 local_348 [8];
  vector<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_> c_15;
  vector<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_> *v1_15;
  vector<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_> *v0_15;
  float local_318 [2];
  vector<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_> *local_310;
  float4 c_14;
  float4 *v1_14;
  float4 *v0_14;
  undefined1 local_2d8 [8];
  vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_> c_13;
  vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_> *v1_13;
  vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_> *v0_13;
  float local_2a8;
  vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_> *local_294;
  float3 c_12;
  float3 *v1_12;
  float3 *v0_12;
  undefined1 local_260 [8];
  vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_> c_11;
  vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_> *v1_11;
  vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_> *v0_11;
  array<float,_2UL> local_230;
  float2 c_10;
  float2 *v1_10;
  float2 *v0_10;
  undefined1 local_200 [8];
  vector<float,_std::allocator<float>_> c_9;
  vector<float,_std::allocator<float>_> *v1_9;
  vector<float,_std::allocator<float>_> *v0_9;
  float *pfStack_1d0;
  float c_8;
  float *v1_8;
  float *v0_8;
  undefined1 local_1a8 [8];
  vector<std::array<tinyusdz::value::half,_4UL>,_std::allocator<std::array<tinyusdz::value::half,_4UL>_>_>
  c_7;
  vector<std::array<tinyusdz::value::half,_4UL>,_std::allocator<std::array<tinyusdz::value::half,_4UL>_>_>
  *v1_7;
  vector<std::array<tinyusdz::value::half,_4UL>,_std::allocator<std::array<tinyusdz::value::half,_4UL>_>_>
  *v0_7;
  array<tinyusdz::value::half,_4UL> local_178;
  half4 c_6;
  half4 *v1_6;
  half4 *v0_6;
  undefined1 local_148 [8];
  vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
  c_5;
  vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
  *v1_5;
  vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
  *v0_5;
  array<tinyusdz::value::half,_3UL> local_116;
  array<tinyusdz::value::half,_3UL> *paStack_110;
  half3 c_4;
  half3 *v1_4;
  half3 *v0_4;
  undefined1 local_e8 [8];
  vector<std::array<tinyusdz::value::half,_2UL>,_std::allocator<std::array<tinyusdz::value::half,_2UL>_>_>
  c_3;
  vector<std::array<tinyusdz::value::half,_2UL>,_std::allocator<std::array<tinyusdz::value::half,_2UL>_>_>
  *v1_3;
  vector<std::array<tinyusdz::value::half,_2UL>,_std::allocator<std::array<tinyusdz::value::half,_2UL>_>_>
  *v0_3;
  array<tinyusdz::value::half,_2UL> *paStack_b8;
  half2 c_2;
  half2 *v1_2;
  half2 *v0_2;
  undefined1 local_90 [8];
  vector<tinyusdz::value::half,_std::allocator<tinyusdz::value::half>_> c_1;
  vector<tinyusdz::value::half,_std::allocator<tinyusdz::value::half>_> *v1_1;
  vector<tinyusdz::value::half,_std::allocator<tinyusdz::value::half>_> *v0_1;
  half *phStack_60;
  half c;
  half *v1;
  half *v0;
  Value result;
  bool ok;
  uint32_t tyid;
  Value *dst_local;
  double dt_local;
  Value *b_local;
  Value *a_local;
  
  if (dst == (Value *)0x0) {
    a_local._7_1_ = false;
  }
  else {
    uVar2 = Value::type_id(a);
    uVar3 = Value::type_id(b);
    if (uVar2 == uVar3) {
      result.v_.vtable._4_4_ = Value::type_id(a);
      bVar1 = IsLerpSupportedType(result.v_.vtable._4_4_);
      if (bVar1) {
        result.v_.vtable._3_1_ = 0;
        Value::Value((Value *)&v0);
        uVar2 = result.v_.vtable._4_4_;
        uVar4 = TypeTraits<tinyusdz::value::half>::type_id();
        uVar3 = result.v_.vtable._4_4_;
        if (uVar2 == uVar4) {
          a_00 = Value::as<tinyusdz::value::half>(a,false);
          phStack_60 = Value::as<tinyusdz::value::half>(b,false);
          if ((a_00 != (half *)0x0) && (phStack_60 != (half *)0x0)) {
            v0_1._4_2_ = lerp<tinyusdz::value::half>(a_00,phStack_60,dt);
            v0_1._6_2_ = v0_1._4_2_;
            Value::operator=((Value *)&v0,(half *)((long)&v0_1 + 6));
            result.v_.vtable._3_1_ = 1;
          }
        }
        else {
          uVar4 = TypeTraits<std::vector<tinyusdz::value::half,_std::allocator<tinyusdz::value::half>_>_>
                  ::type_id();
          uVar2 = result.v_.vtable._4_4_;
          if (uVar3 == uVar4) {
            a_01 = Value::
                   as<std::vector<tinyusdz::value::half,std::allocator<tinyusdz::value::half>>>
                             (a,false);
            c_1.super__Vector_base<tinyusdz::value::half,_std::allocator<tinyusdz::value::half>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage =
                 (pointer)Value::
                          as<std::vector<tinyusdz::value::half,std::allocator<tinyusdz::value::half>>>
                                    (b,false);
            ::std::vector<tinyusdz::value::half,_std::allocator<tinyusdz::value::half>_>::vector
                      ((vector<tinyusdz::value::half,_std::allocator<tinyusdz::value::half>_> *)
                       local_90);
            if ((a_01 != (vector<tinyusdz::value::half,_std::allocator<tinyusdz::value::half>_> *)
                         0x0) &&
               (c_1.
                super__Vector_base<tinyusdz::value::half,_std::allocator<tinyusdz::value::half>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)0x0)) {
              lerp<tinyusdz::value::half>
                        ((vector<tinyusdz::value::half,_std::allocator<tinyusdz::value::half>_> *)
                         &v0_2,a_01,
                         (vector<tinyusdz::value::half,_std::allocator<tinyusdz::value::half>_> *)
                         c_1.
                         super__Vector_base<tinyusdz::value::half,_std::allocator<tinyusdz::value::half>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage,dt);
              ::std::vector<tinyusdz::value::half,_std::allocator<tinyusdz::value::half>_>::
              operator=((vector<tinyusdz::value::half,_std::allocator<tinyusdz::value::half>_> *)
                        local_90,(vector<tinyusdz::value::half,_std::allocator<tinyusdz::value::half>_>
                                  *)&v0_2);
              ::std::vector<tinyusdz::value::half,_std::allocator<tinyusdz::value::half>_>::~vector
                        ((vector<tinyusdz::value::half,_std::allocator<tinyusdz::value::half>_> *)
                         &v0_2);
              Value::operator=((Value *)&v0,
                               (vector<tinyusdz::value::half,_std::allocator<tinyusdz::value::half>_>
                                *)local_90);
              result.v_.vtable._3_1_ = 1;
            }
            ::std::vector<tinyusdz::value::half,_std::allocator<tinyusdz::value::half>_>::~vector
                      ((vector<tinyusdz::value::half,_std::allocator<tinyusdz::value::half>_> *)
                       local_90);
          }
          else {
            uVar4 = TypeTraits<std::array<tinyusdz::value::half,_2UL>_>::type_id();
            uVar3 = result.v_.vtable._4_4_;
            if (uVar2 == uVar4) {
              a_02 = Value::as<std::array<tinyusdz::value::half,2ul>>(a,false);
              paStack_b8 = Value::as<std::array<tinyusdz::value::half,2ul>>(b,false);
              if ((a_02 != (array<tinyusdz::value::half,_2UL> *)0x0) &&
                 (paStack_b8 != (array<tinyusdz::value::half,_2UL> *)0x0)) {
                v0_3._0_4_ = lerp<std::array<tinyusdz::value::half,2ul>>(a_02,paStack_b8,dt);
                v0_3._4_4_ = v0_3._0_4_;
                Value::operator=((Value *)&v0,(array<tinyusdz::value::half,_2UL> *)((long)&v0_3 + 4)
                                );
                result.v_.vtable._3_1_ = 1;
              }
            }
            else {
              uVar4 = TypeTraits<std::vector<std::array<tinyusdz::value::half,_2UL>,_std::allocator<std::array<tinyusdz::value::half,_2UL>_>_>_>
                      ::type_id();
              uVar2 = result.v_.vtable._4_4_;
              b_00 = (vector<std::array<tinyusdz::value::half,_2UL>,_std::allocator<std::array<tinyusdz::value::half,_2UL>_>_>
                      *)(ulong)uVar4;
              if (uVar3 == uVar4) {
                ptVar11 = (tinyusdz *)
                          Value::
                          as<std::vector<std::array<tinyusdz::value::half,2ul>,std::allocator<std::array<tinyusdz::value::half,2ul>>>>
                                    (a,false);
                c_3.
                super__Vector_base<std::array<tinyusdz::value::half,_2UL>,_std::allocator<std::array<tinyusdz::value::half,_2UL>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage =
                     (pointer)Value::
                              as<std::vector<std::array<tinyusdz::value::half,2ul>,std::allocator<std::array<tinyusdz::value::half,2ul>>>>
                                        (b,false);
                ::std::
                vector<std::array<tinyusdz::value::half,_2UL>,_std::allocator<std::array<tinyusdz::value::half,_2UL>_>_>
                ::vector((vector<std::array<tinyusdz::value::half,_2UL>,_std::allocator<std::array<tinyusdz::value::half,_2UL>_>_>
                          *)local_e8);
                if ((ptVar11 != (tinyusdz *)0x0) &&
                   (c_3.
                    super__Vector_base<std::array<tinyusdz::value::half,_2UL>,_std::allocator<std::array<tinyusdz::value::half,_2UL>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)0x0)) {
                  lerp<std::array<tinyusdz::value::half,2ul>>
                            ((vector<std::array<tinyusdz::value::half,_2UL>,_std::allocator<std::array<tinyusdz::value::half,_2UL>_>_>
                              *)&v0_4,ptVar11,
                             (vector<std::array<tinyusdz::value::half,_2UL>,_std::allocator<std::array<tinyusdz::value::half,_2UL>_>_>
                              *)c_3.
                                super__Vector_base<std::array<tinyusdz::value::half,_2UL>,_std::allocator<std::array<tinyusdz::value::half,_2UL>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage,b_00,dt);
                  ::std::
                  vector<std::array<tinyusdz::value::half,_2UL>,_std::allocator<std::array<tinyusdz::value::half,_2UL>_>_>
                  ::operator=((vector<std::array<tinyusdz::value::half,_2UL>,_std::allocator<std::array<tinyusdz::value::half,_2UL>_>_>
                               *)local_e8,
                              (vector<std::array<tinyusdz::value::half,_2UL>,_std::allocator<std::array<tinyusdz::value::half,_2UL>_>_>
                               *)&v0_4);
                  ::std::
                  vector<std::array<tinyusdz::value::half,_2UL>,_std::allocator<std::array<tinyusdz::value::half,_2UL>_>_>
                  ::~vector((vector<std::array<tinyusdz::value::half,_2UL>,_std::allocator<std::array<tinyusdz::value::half,_2UL>_>_>
                             *)&v0_4);
                  Value::operator=((Value *)&v0,
                                   (vector<std::array<tinyusdz::value::half,_2UL>,_std::allocator<std::array<tinyusdz::value::half,_2UL>_>_>
                                    *)local_e8);
                  result.v_.vtable._3_1_ = 1;
                }
                ::std::
                vector<std::array<tinyusdz::value::half,_2UL>,_std::allocator<std::array<tinyusdz::value::half,_2UL>_>_>
                ::~vector((vector<std::array<tinyusdz::value::half,_2UL>,_std::allocator<std::array<tinyusdz::value::half,_2UL>_>_>
                           *)local_e8);
              }
              else {
                uVar4 = TypeTraits<std::array<tinyusdz::value::half,_3UL>_>::type_id();
                uVar3 = result.v_.vtable._4_4_;
                if (uVar2 == uVar4) {
                  a_03 = Value::as<std::array<tinyusdz::value::half,3ul>>(a,false);
                  paStack_110 = Value::as<std::array<tinyusdz::value::half,3ul>>(b,false);
                  if ((a_03 != (array<tinyusdz::value::half,_3UL> *)0x0) &&
                     (paStack_110 != (array<tinyusdz::value::half,_3UL> *)0x0)) {
                    hVar5 = lerp<std::array<tinyusdz::value::half,3ul>>(a_03,paStack_110,dt);
                    local_116._M_elems._0_4_ = hVar5._M_elems._0_4_;
                    local_116._M_elems[2].value = hVar5._M_elems[2].value;
                    Value::operator=((Value *)&v0,&local_116);
                    result.v_.vtable._3_1_ = 1;
                  }
                }
                else {
                  uVar4 = TypeTraits<std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>_>
                          ::type_id();
                  uVar2 = result.v_.vtable._4_4_;
                  b_01 = (vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
                          *)(ulong)uVar4;
                  if (uVar3 == uVar4) {
                    ptVar11 = (tinyusdz *)
                              Value::
                              as<std::vector<std::array<tinyusdz::value::half,3ul>,std::allocator<std::array<tinyusdz::value::half,3ul>>>>
                                        (a,false);
                    c_5.
                    super__Vector_base<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage =
                         (pointer)Value::
                                  as<std::vector<std::array<tinyusdz::value::half,3ul>,std::allocator<std::array<tinyusdz::value::half,3ul>>>>
                                            (b,false);
                    ::std::
                    vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
                    ::vector((vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
                              *)local_148);
                    if ((ptVar11 != (tinyusdz *)0x0) &&
                       (c_5.
                        super__Vector_base<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)0x0)) {
                      lerp<std::array<tinyusdz::value::half,3ul>>
                                ((vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
                                  *)&v0_6,ptVar11,
                                 (vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
                                  *)c_5.
                                    super__Vector_base<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage,b_01,dt);
                      ::std::
                      vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
                      ::operator=((vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
                                   *)local_148,
                                  (vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
                                   *)&v0_6);
                      ::std::
                      vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
                      ::~vector((vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
                                 *)&v0_6);
                      Value::operator=((Value *)&v0,
                                       (vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
                                        *)local_148);
                      result.v_.vtable._3_1_ = 1;
                    }
                    ::std::
                    vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
                    ::~vector((vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
                               *)local_148);
                  }
                  else {
                    uVar4 = TypeTraits<std::array<tinyusdz::value::half,_4UL>_>::type_id();
                    uVar3 = result.v_.vtable._4_4_;
                    if (uVar2 == uVar4) {
                      a_04 = Value::as<std::array<tinyusdz::value::half,4ul>>(a,false);
                      c_6._M_elems = (_Type)Value::as<std::array<tinyusdz::value::half,4ul>>
                                                      (b,false);
                      if ((a_04 != (array<tinyusdz::value::half,_4UL> *)0x0) &&
                         (c_6._M_elems != (_Type)0x0)) {
                        local_178._M_elems =
                             (_Type)lerp<std::array<tinyusdz::value::half,4ul>>
                                              (a_04,(half4 *)c_6._M_elems,dt);
                        Value::operator=((Value *)&v0,&local_178);
                        result.v_.vtable._3_1_ = 1;
                      }
                    }
                    else {
                      uVar4 = TypeTraits<std::vector<std::array<tinyusdz::value::half,_4UL>,_std::allocator<std::array<tinyusdz::value::half,_4UL>_>_>_>
                              ::type_id();
                      uVar2 = result.v_.vtable._4_4_;
                      b_02 = (vector<std::array<tinyusdz::value::half,_4UL>,_std::allocator<std::array<tinyusdz::value::half,_4UL>_>_>
                              *)(ulong)uVar4;
                      if (uVar3 == uVar4) {
                        ptVar11 = (tinyusdz *)
                                  Value::
                                  as<std::vector<std::array<tinyusdz::value::half,4ul>,std::allocator<std::array<tinyusdz::value::half,4ul>>>>
                                            (a,false);
                        c_7.
                        super__Vector_base<std::array<tinyusdz::value::half,_4UL>,_std::allocator<std::array<tinyusdz::value::half,_4UL>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage =
                             (pointer)Value::
                                      as<std::vector<std::array<tinyusdz::value::half,4ul>,std::allocator<std::array<tinyusdz::value::half,4ul>>>>
                                                (b,false);
                        ::std::
                        vector<std::array<tinyusdz::value::half,_4UL>,_std::allocator<std::array<tinyusdz::value::half,_4UL>_>_>
                        ::vector((vector<std::array<tinyusdz::value::half,_4UL>,_std::allocator<std::array<tinyusdz::value::half,_4UL>_>_>
                                  *)local_1a8);
                        if ((ptVar11 != (tinyusdz *)0x0) &&
                           (c_7.
                            super__Vector_base<std::array<tinyusdz::value::half,_4UL>,_std::allocator<std::array<tinyusdz::value::half,_4UL>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)0x0)) {
                          lerp<std::array<tinyusdz::value::half,4ul>>
                                    ((vector<std::array<tinyusdz::value::half,_4UL>,_std::allocator<std::array<tinyusdz::value::half,_4UL>_>_>
                                      *)&v0_8,ptVar11,
                                     (vector<std::array<tinyusdz::value::half,_4UL>,_std::allocator<std::array<tinyusdz::value::half,_4UL>_>_>
                                      *)c_7.
                                        super__Vector_base<std::array<tinyusdz::value::half,_4UL>,_std::allocator<std::array<tinyusdz::value::half,_4UL>_>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage,b_02,dt);
                          ::std::
                          vector<std::array<tinyusdz::value::half,_4UL>,_std::allocator<std::array<tinyusdz::value::half,_4UL>_>_>
                          ::operator=((vector<std::array<tinyusdz::value::half,_4UL>,_std::allocator<std::array<tinyusdz::value::half,_4UL>_>_>
                                       *)local_1a8,
                                      (vector<std::array<tinyusdz::value::half,_4UL>,_std::allocator<std::array<tinyusdz::value::half,_4UL>_>_>
                                       *)&v0_8);
                          ::std::
                          vector<std::array<tinyusdz::value::half,_4UL>,_std::allocator<std::array<tinyusdz::value::half,_4UL>_>_>
                          ::~vector((vector<std::array<tinyusdz::value::half,_4UL>,_std::allocator<std::array<tinyusdz::value::half,_4UL>_>_>
                                     *)&v0_8);
                          Value::operator=((Value *)&v0,
                                           (vector<std::array<tinyusdz::value::half,_4UL>,_std::allocator<std::array<tinyusdz::value::half,_4UL>_>_>
                                            *)local_1a8);
                          result.v_.vtable._3_1_ = 1;
                        }
                        ::std::
                        vector<std::array<tinyusdz::value::half,_4UL>,_std::allocator<std::array<tinyusdz::value::half,_4UL>_>_>
                        ::~vector((vector<std::array<tinyusdz::value::half,_4UL>,_std::allocator<std::array<tinyusdz::value::half,_4UL>_>_>
                                   *)local_1a8);
                      }
                      else {
                        uVar4 = TypeTraits<float>::type_id();
                        uVar3 = result.v_.vtable._4_4_;
                        if (uVar2 == uVar4) {
                          v1_8 = Value::as<float>(a,false);
                          pfStack_1d0 = Value::as<float>(b,false);
                          if ((v1_8 != (float *)0x0) && (pfStack_1d0 != (float *)0x0)) {
                            v0_9._4_4_ = lerp<float>(v1_8,pfStack_1d0,dt);
                            Value::operator=((Value *)&v0,(float *)((long)&v0_9 + 4));
                            result.v_.vtable._3_1_ = 1;
                          }
                        }
                        else {
                          uVar4 = TypeTraits<std::vector<float,_std::allocator<float>_>_>::type_id()
                          ;
                          uVar2 = result.v_.vtable._4_4_;
                          if (uVar3 == uVar4) {
                            a_05 = Value::as<std::vector<float,std::allocator<float>>>(a,false);
                            c_9.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage =
                                 (pointer)Value::as<std::vector<float,std::allocator<float>>>
                                                    (b,false);
                            ::std::vector<float,_std::allocator<float>_>::vector
                                      ((vector<float,_std::allocator<float>_> *)local_200);
                            if ((a_05 != (vector<float,_std::allocator<float>_> *)0x0) &&
                               (c_9.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage != (pointer)0x0)) {
                              lerp<float>((vector<float,_std::allocator<float>_> *)&v0_10,a_05,
                                          (vector<float,_std::allocator<float>_> *)
                                          c_9.super__Vector_base<float,_std::allocator<float>_>.
                                          _M_impl.super__Vector_impl_data._M_end_of_storage,dt);
                              ::std::vector<float,_std::allocator<float>_>::operator=
                                        ((vector<float,_std::allocator<float>_> *)local_200,
                                         (vector<float,_std::allocator<float>_> *)&v0_10);
                              ::std::vector<float,_std::allocator<float>_>::~vector
                                        ((vector<float,_std::allocator<float>_> *)&v0_10);
                              Value::operator=((Value *)&v0,
                                               (vector<float,_std::allocator<float>_> *)local_200);
                              result.v_.vtable._3_1_ = 1;
                            }
                            ::std::vector<float,_std::allocator<float>_>::~vector
                                      ((vector<float,_std::allocator<float>_> *)local_200);
                          }
                          else {
                            uVar4 = TypeTraits<std::array<float,_2UL>_>::type_id();
                            uVar3 = result.v_.vtable._4_4_;
                            if (uVar2 == uVar4) {
                              a_06 = Value::as<std::array<float,2ul>>(a,false);
                              c_10._M_elems = (_Type)Value::as<std::array<float,2ul>>(b,false);
                              if ((a_06 != (array<float,_2UL> *)0x0) &&
                                 (c_10._M_elems != (_Type)0x0)) {
                                local_230._M_elems =
                                     (_Type)lerp<std::array<float,2ul>>
                                                      (a_06,(float2 *)c_10._M_elems,dt);
                                Value::operator=((Value *)&v0,&local_230);
                                result.v_.vtable._3_1_ = 1;
                              }
                            }
                            else {
                              uVar4 = TypeTraits<std::vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>_>
                                      ::type_id();
                              uVar2 = result.v_.vtable._4_4_;
                              b_03 = (vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>
                                      *)(ulong)uVar4;
                              if (uVar3 == uVar4) {
                                ptVar11 = (tinyusdz *)
                                          Value::
                                          as<std::vector<std::array<float,2ul>,std::allocator<std::array<float,2ul>>>>
                                                    (a,false);
                                c_11.
                                super__Vector_base<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage =
                                     (pointer)Value::
                                              as<std::vector<std::array<float,2ul>,std::allocator<std::array<float,2ul>>>>
                                                        (b,false);
                                ::std::
                                vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>
                                ::vector((vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>
                                          *)local_260);
                                if ((ptVar11 != (tinyusdz *)0x0) &&
                                   (c_11.
                                    super__Vector_base<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage !=
                                    (pointer)0x0)) {
                                  lerp<std::array<float,2ul>>
                                            ((vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>
                                              *)&v0_12,ptVar11,
                                             (vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>
                                              *)c_11.
                                                super__Vector_base<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>
                                                ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                             b_03,dt);
                                  ::std::
                                  vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>
                                  ::operator=((vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>
                                               *)local_260,
                                              (vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>
                                               *)&v0_12);
                                  ::std::
                                  vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>
                                  ::~vector((vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>
                                             *)&v0_12);
                                  Value::operator=((Value *)&v0,
                                                   (
                                                  vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>
                                                  *)local_260);
                                  result.v_.vtable._3_1_ = 1;
                                }
                                ::std::
                                vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>
                                ::~vector((vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>
                                           *)local_260);
                              }
                              else {
                                uVar4 = TypeTraits<std::array<float,_3UL>_>::type_id();
                                uVar3 = result.v_.vtable._4_4_;
                                if (uVar2 == uVar4) {
                                  a_07 = Value::as<std::array<float,3ul>>(a,false);
                                  c_12._M_elems._4_8_ = Value::as<std::array<float,3ul>>(b,false);
                                  if ((a_07 != (array<float,_3UL> *)0x0) &&
                                     ((array<float,_3UL> *)c_12._M_elems._4_8_ !=
                                      (array<float,_3UL> *)0x0)) {
                                    fVar12 = lerp<std::array<float,3ul>>
                                                       (a_07,(float3 *)c_12._M_elems._4_8_,dt);
                                    v0_13 = fVar12._M_elems._0_8_;
                                    local_2a8 = fVar12._M_elems[2];
                                    local_294 = v0_13;
                                    c_12._M_elems[0] = local_2a8;
                                    Value::operator=((Value *)&v0,(array<float,_3UL> *)&local_294);
                                    result.v_.vtable._3_1_ = 1;
                                  }
                                }
                                else {
                                  uVar4 = TypeTraits<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>
                                          ::type_id();
                                  uVar2 = result.v_.vtable._4_4_;
                                  b_04 = (vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                                          *)(ulong)uVar4;
                                  if (uVar3 == uVar4) {
                                    ptVar11 = (tinyusdz *)
                                              Value::
                                              as<std::vector<std::array<float,3ul>,std::allocator<std::array<float,3ul>>>>
                                                        (a,false);
                                    c_13.
                                    super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage =
                                         (pointer)Value::
                                                  as<std::vector<std::array<float,3ul>,std::allocator<std::array<float,3ul>>>>
                                                            (b,false);
                                    ::std::
                                    vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                                    ::vector((vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                                              *)local_2d8);
                                    if ((ptVar11 != (tinyusdz *)0x0) &&
                                       (c_13.
                                        super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage !=
                                        (pointer)0x0)) {
                                      lerp<std::array<float,3ul>>
                                                ((vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                                                  *)&v0_14,ptVar11,
                                                 (vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                                                  *)c_13.
                                                  super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                 ,b_04,dt);
                                      ::std::
                                      vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                                      ::operator=((
                                                  vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                                                  *)local_2d8,
                                                  (
                                                  vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                                                  *)&v0_14);
                                      ::std::
                                      vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                                      ::~vector((vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                                                 *)&v0_14);
                                      Value::operator=((Value *)&v0,
                                                       (
                                                  vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                                                  *)local_2d8);
                                      result.v_.vtable._3_1_ = 1;
                                    }
                                    ::std::
                                    vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                                    ::~vector((vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                                               *)local_2d8);
                                  }
                                  else {
                                    uVar4 = TypeTraits<std::array<float,_4UL>_>::type_id();
                                    uVar3 = result.v_.vtable._4_4_;
                                    if (uVar2 == uVar4) {
                                      a_08 = Value::as<std::array<float,4ul>>(a,false);
                                      c_14._M_elems._8_8_ =
                                           Value::as<std::array<float,4ul>>(b,false);
                                      if ((a_08 != (array<float,_4UL> *)0x0) &&
                                         ((array<float,_4UL> *)c_14._M_elems._8_8_ !=
                                          (array<float,_4UL> *)0x0)) {
                                        fVar18 = lerp<std::array<float,4ul>>
                                                           (a_08,(float4 *)c_14._M_elems._8_8_,dt);
                                        v0_15 = fVar18._M_elems._0_8_;
                                        local_310 = v0_15;
                                        local_318 = fVar18._M_elems._8_8_;
                                        c_14._M_elems[0] = local_318[0];
                                        c_14._M_elems[1] = local_318[1];
                                        Value::operator=((Value *)&v0,
                                                         (array<float,_4UL> *)&local_310);
                                        result.v_.vtable._3_1_ = 1;
                                      }
                                    }
                                    else {
                                      uVar4 = TypeTraits<std::vector<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>_>
                                              ::type_id();
                                      uVar2 = result.v_.vtable._4_4_;
                                      b_05 = (vector<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>
                                              *)(ulong)uVar4;
                                      if (uVar3 == uVar4) {
                                        ptVar11 = (tinyusdz *)
                                                  Value::
                                                  as<std::vector<std::array<float,4ul>,std::allocator<std::array<float,4ul>>>>
                                                            (a,false);
                                        c_15.
                                        super__Vector_base<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage =
                                             (pointer)Value::
                                                  as<std::vector<std::array<float,4ul>,std::allocator<std::array<float,4ul>>>>
                                                            (b,false);
                                        ::std::
                                        vector<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>
                                        ::vector((vector<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>
                                                  *)local_348);
                                        if ((ptVar11 != (tinyusdz *)0x0) &&
                                           (c_15.
                                            super__Vector_base<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>
                                            ._M_impl.super__Vector_impl_data._M_end_of_storage !=
                                            (pointer)0x0)) {
                                          lerp<std::array<float,4ul>>
                                                    ((
                                                  vector<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>
                                                  *)&v0_16,ptVar11,
                                                  (
                                                  vector<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>
                                                  *)c_15.
                                                  super__Vector_base<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  ,b_05,dt);
                                          ::std::
                                          vector<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>
                                          ::operator=((
                                                  vector<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>
                                                  *)local_348,
                                                  (
                                                  vector<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>
                                                  *)&v0_16);
                                          ::std::
                                          vector<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>
                                          ::~vector((
                                                  vector<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>
                                                  *)&v0_16);
                                          Value::operator=((Value *)&v0,
                                                           (
                                                  vector<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>
                                                  *)local_348);
                                          result.v_.vtable._3_1_ = 1;
                                        }
                                        ::std::
                                        vector<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>
                                        ::~vector((
                                                  vector<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>
                                                  *)local_348);
                                      }
                                      else {
                                        uVar4 = TypeTraits<double>::type_id();
                                        uVar3 = result.v_.vtable._4_4_;
                                        if (uVar2 == uVar4) {
                                          v1_16 = Value::as<double>(a,false);
                                          c_16 = (double)Value::as<double>(b,false);
                                          if ((v1_16 != (double *)0x0) &&
                                             ((double *)c_16 != (double *)0x0)) {
                                            v0_17 = (vector<double,_std::allocator<double>_> *)
                                                    lerp<double>(v1_16,(double *)c_16,dt);
                                            Value::operator=((Value *)&v0,(double *)&v0_17);
                                            result.v_.vtable._3_1_ = 1;
                                          }
                                        }
                                        else {
                                          uVar4 = TypeTraits<std::vector<double,_std::allocator<double>_>_>
                                                  ::type_id();
                                          uVar2 = result.v_.vtable._4_4_;
                                          if (uVar3 == uVar4) {
                                            a_09 = Value::
                                                  as<std::vector<double,std::allocator<double>>>
                                                            (a,false);
                                            c_17.super__Vector_base<double,_std::allocator<double>_>
                                            ._M_impl.super__Vector_impl_data._M_end_of_storage =
                                                 (pointer)Value::
                                                  as<std::vector<double,std::allocator<double>>>
                                                            (b,false);
                                            ::std::vector<double,_std::allocator<double>_>::vector
                                                      ((vector<double,_std::allocator<double>_> *)
                                                       local_3a0);
                                            if ((a_09 != (vector<double,_std::allocator<double>_> *)
                                                         0x0) &&
                                               (c_17.
                                                super__Vector_base<double,_std::allocator<double>_>.
                                                _M_impl.super__Vector_impl_data._M_end_of_storage !=
                                                (pointer)0x0)) {
                                              lerp<double>((vector<double,_std::allocator<double>_>
                                                            *)&v0_18,a_09,
                                                           (vector<double,_std::allocator<double>_>
                                                            *)c_17.
                                                  super__Vector_base<double,_std::allocator<double>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  ,dt);
                                              ::std::vector<double,_std::allocator<double>_>::
                                              operator=((vector<double,_std::allocator<double>_> *)
                                                        local_3a0,
                                                        (vector<double,_std::allocator<double>_> *)
                                                        &v0_18);
                                              ::std::vector<double,_std::allocator<double>_>::
                                              ~vector((vector<double,_std::allocator<double>_> *)
                                                      &v0_18);
                                              Value::operator=((Value *)&v0,
                                                               (
                                                  vector<double,_std::allocator<double>_> *)
                                                  local_3a0);
                                              result.v_.vtable._3_1_ = 1;
                                            }
                                            ::std::vector<double,_std::allocator<double>_>::~vector
                                                      ((vector<double,_std::allocator<double>_> *)
                                                       local_3a0);
                                          }
                                          else {
                                            uVar4 = TypeTraits<std::array<double,_2UL>_>::type_id();
                                            uVar3 = result.v_.vtable._4_4_;
                                            if (uVar2 == uVar4) {
                                              a_10 = Value::as<std::array<double,2ul>>(a,false);
                                              c_18._M_elems[1] =
                                                   (double)Value::as<std::array<double,2ul>>
                                                                     (b,false);
                                              if ((a_10 != (array<double,_2UL> *)0x0) &&
                                                 ((array<double,_2UL> *)c_18._M_elems[1] !=
                                                  (array<double,_2UL> *)0x0)) {
                                                dVar19 = lerp<std::array<double,2ul>>
                                                                   (a_10,(double2 *)c_18._M_elems[1]
                                                                    ,dt);
                                                v0_19 = dVar19._M_elems[0];
                                                local_3d8 = (undefined1  [8])v0_19;
                                                local_3e0 = dVar19._M_elems[1];
                                                c_18._M_elems[0] = local_3e0;
                                                Value::operator=((Value *)&v0,
                                                                 (array<double,_2UL> *)local_3d8);
                                                result.v_.vtable._3_1_ = 1;
                                              }
                                            }
                                            else {
                                              uVar4 = 
                                                  TypeTraits<std::vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>_>
                                                  ::type_id();
                                              uVar2 = result.v_.vtable._4_4_;
                                              b_06 = (
                                                  vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>
                                                  *)(ulong)uVar4;
                                              if (uVar3 == uVar4) {
                                                ptVar11 = (tinyusdz *)
                                                          Value::
                                                  as<std::vector<std::array<double,2ul>,std::allocator<std::array<double,2ul>>>>
                                                            (a,false);
                                                c_19.
                                                super__Vector_base<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>
                                                ._M_impl.super__Vector_impl_data._M_end_of_storage =
                                                     (pointer)Value::
                                                  as<std::vector<std::array<double,2ul>,std::allocator<std::array<double,2ul>>>>
                                                            (b,false);
                                                ::std::
                                                vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>
                                                ::vector((
                                                  vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>
                                                  *)local_410);
                                                if ((ptVar11 != (tinyusdz *)0x0) &&
                                                   (c_19.
                                                  super__Vector_base<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  != (pointer)0x0)) {
                                                  lerp<std::array<double,2ul>>
                                                            ((
                                                  vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>
                                                  *)&v0_20,ptVar11,
                                                  (
                                                  vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>
                                                  *)c_19.
                                                  super__Vector_base<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  ,b_06,dt);
                                                  ::std::
                                                  vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>
                                                  ::operator=((
                                                  vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>
                                                  *)local_410,
                                                  (
                                                  vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>
                                                  *)&v0_20);
                                                  ::std::
                                                  vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>
                                                  ::~vector((
                                                  vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>
                                                  *)&v0_20);
                                                  Value::operator=((Value *)&v0,
                                                                   (
                                                  vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>
                                                  *)local_410);
                                                  result.v_.vtable._3_1_ = 1;
                                                }
                                                ::std::
                                                vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>
                                                ::~vector((
                                                  vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>
                                                  *)local_410);
                                              }
                                              else {
                                                uVar4 = TypeTraits<std::array<double,_3UL>_>::
                                                        type_id();
                                                uVar3 = result.v_.vtable._4_4_;
                                                b_07 = (double3 *)(ulong)uVar4;
                                                if (uVar2 == uVar4) {
                                                  ptVar11 = (tinyusdz *)
                                                            Value::as<std::array<double,3ul>>
                                                                      (a,false);
                                                  c_20._M_elems[2] =
                                                       (double)Value::as<std::array<double,3ul>>
                                                                         (b,false);
                                                  if ((ptVar11 != (tinyusdz *)0x0) &&
                                                     ((array<double,_3UL> *)c_20._M_elems[2] !=
                                                      (array<double,_3UL> *)0x0)) {
                                                    lerp<std::array<double,3ul>>
                                                              ((double3 *)&v0_21,ptVar11,
                                                               (double3 *)c_20._M_elems[2],b_07,dt);
                                                    local_450 = (undefined1  [8])v0_21;
                                                    c_20._M_elems[0] = local_460;
                                                    c_20._M_elems[1] = local_458;
                                                    Value::operator=((Value *)&v0,
                                                                     (array<double,_3UL> *)local_450
                                                                    );
                                                    result.v_.vtable._3_1_ = 1;
                                                  }
                                                }
                                                else {
                                                  uVar4 = 
                                                  TypeTraits<std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>_>
                                                  ::type_id();
                                                  uVar2 = result.v_.vtable._4_4_;
                                                  b_08 = (
                                                  vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>
                                                  *)(ulong)uVar4;
                                                  if (uVar3 == uVar4) {
                                                    ptVar11 = (tinyusdz *)
                                                              Value::
                                                  as<std::vector<std::array<double,3ul>,std::allocator<std::array<double,3ul>>>>
                                                            (a,false);
                                                  c_21.
                                                  super__Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                       = (pointer)Value::
                                                  as<std::vector<std::array<double,3ul>,std::allocator<std::array<double,3ul>>>>
                                                            (b,false);
                                                  ::std::
                                                  vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>
                                                  ::vector((
                                                  vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>
                                                  *)local_490);
                                                  if ((ptVar11 != (tinyusdz *)0x0) &&
                                                     (c_21.
                                                  super__Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  != (pointer)0x0)) {
                                                    lerp<std::array<double,3ul>>
                                                              ((
                                                  vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>
                                                  *)&v0_22,ptVar11,
                                                  (
                                                  vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>
                                                  *)c_21.
                                                  super__Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  ,b_08,dt);
                                                  ::std::
                                                  vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>
                                                  ::operator=((
                                                  vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>
                                                  *)local_490,
                                                  (
                                                  vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>
                                                  *)&v0_22);
                                                  ::std::
                                                  vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>
                                                  ::~vector((
                                                  vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>
                                                  *)&v0_22);
                                                  Value::operator=((Value *)&v0,
                                                                   (
                                                  vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>
                                                  *)local_490);
                                                  result.v_.vtable._3_1_ = 1;
                                                  }
                                                  ::std::
                                                  vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>
                                                  ::~vector((
                                                  vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>
                                                  *)local_490);
                                                  }
                                                  else {
                                                    uVar4 = TypeTraits<std::array<double,_4UL>_>::
                                                            type_id();
                                                    uVar3 = result.v_.vtable._4_4_;
                                                    b_09 = (double4 *)(ulong)uVar4;
                                                    if (uVar2 == uVar4) {
                                                      ptVar11 = (tinyusdz *)
                                                                Value::as<std::array<double,4ul>>
                                                                          (a,false);
                                                      c_22._M_elems[3] =
                                                           (double)Value::as<std::array<double,4ul>>
                                                                             (b,false);
                                                      if ((ptVar11 != (tinyusdz *)0x0) &&
                                                         ((array<double,_4UL> *)c_22._M_elems[3] !=
                                                          (array<double,_4UL> *)0x0)) {
                                                        lerp<std::array<double,4ul>>
                                                                  ((double4 *)&v0_23,ptVar11,
                                                                   (double4 *)c_22._M_elems[3],b_09,
                                                                   dt);
                                                        local_4d8 = (undefined1  [8])v0_23;
                                                        c_22._M_elems[0] = local_4f0;
                                                        c_22._M_elems[1] = local_4e8;
                                                        c_22._M_elems[2] = local_4e0;
                                                        Value::operator=((Value *)&v0,
                                                                         (array<double,_4UL> *)
                                                                         local_4d8);
                                                        result.v_.vtable._3_1_ = 1;
                                                      }
                                                    }
                                                    else {
                                                      uVar4 = 
                                                  TypeTraits<std::vector<std::array<double,_4UL>,_std::allocator<std::array<double,_4UL>_>_>_>
                                                  ::type_id();
                                                  uVar2 = result.v_.vtable._4_4_;
                                                  b_10 = (
                                                  vector<std::array<double,_4UL>,_std::allocator<std::array<double,_4UL>_>_>
                                                  *)(ulong)uVar4;
                                                  if (uVar3 == uVar4) {
                                                    ptVar11 = (tinyusdz *)
                                                              Value::
                                                  as<std::vector<std::array<double,4ul>,std::allocator<std::array<double,4ul>>>>
                                                            (a,false);
                                                  c_23.
                                                  super__Vector_base<std::array<double,_4UL>,_std::allocator<std::array<double,_4UL>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                       = (pointer)Value::
                                                  as<std::vector<std::array<double,4ul>,std::allocator<std::array<double,4ul>>>>
                                                            (b,false);
                                                  ::std::
                                                  vector<std::array<double,_4UL>,_std::allocator<std::array<double,_4UL>_>_>
                                                  ::vector((
                                                  vector<std::array<double,_4UL>,_std::allocator<std::array<double,_4UL>_>_>
                                                  *)local_520);
                                                  if ((ptVar11 != (tinyusdz *)0x0) &&
                                                     (c_23.
                                                  super__Vector_base<std::array<double,_4UL>,_std::allocator<std::array<double,_4UL>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  != (pointer)0x0)) {
                                                    lerp<std::array<double,4ul>>
                                                              ((
                                                  vector<std::array<double,_4UL>,_std::allocator<std::array<double,_4UL>_>_>
                                                  *)&v0_24,ptVar11,
                                                  (
                                                  vector<std::array<double,_4UL>,_std::allocator<std::array<double,_4UL>_>_>
                                                  *)c_23.
                                                  super__Vector_base<std::array<double,_4UL>,_std::allocator<std::array<double,_4UL>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  ,b_10,dt);
                                                  ::std::
                                                  vector<std::array<double,_4UL>,_std::allocator<std::array<double,_4UL>_>_>
                                                  ::operator=((
                                                  vector<std::array<double,_4UL>,_std::allocator<std::array<double,_4UL>_>_>
                                                  *)local_520,
                                                  (
                                                  vector<std::array<double,_4UL>,_std::allocator<std::array<double,_4UL>_>_>
                                                  *)&v0_24);
                                                  ::std::
                                                  vector<std::array<double,_4UL>,_std::allocator<std::array<double,_4UL>_>_>
                                                  ::~vector((
                                                  vector<std::array<double,_4UL>,_std::allocator<std::array<double,_4UL>_>_>
                                                  *)&v0_24);
                                                  Value::operator=((Value *)&v0,
                                                                   (
                                                  vector<std::array<double,_4UL>,_std::allocator<std::array<double,_4UL>_>_>
                                                  *)local_520);
                                                  result.v_.vtable._3_1_ = 1;
                                                  }
                                                  ::std::
                                                  vector<std::array<double,_4UL>,_std::allocator<std::array<double,_4UL>_>_>
                                                  ::~vector((
                                                  vector<std::array<double,_4UL>,_std::allocator<std::array<double,_4UL>_>_>
                                                  *)local_520);
                                                  }
                                                  else {
                                                    uVar4 = TypeTraits<tinyusdz::value::quath>::
                                                            type_id();
                                                    uVar3 = result.v_.vtable._4_4_;
                                                    if (uVar2 == uVar4) {
                                                      a_11 = Value::as<tinyusdz::value::quath>
                                                                       (a,false);
                                                      c_24 = (quath)Value::
                                                  as<tinyusdz::value::quath>(b,false);
                                                  if ((a_11 != (quath *)0x0) && (c_24 != (quath)0x0)
                                                     ) {
                                                    local_550 = lerp<tinyusdz::value::quath>
                                                                          (a_11,(quath *)c_24,dt);
                                                    Value::operator=((Value *)&v0,&local_550);
                                                    result.v_.vtable._3_1_ = 1;
                                                  }
                                                  }
                                                  else {
                                                    uVar4 = 
                                                  TypeTraits<std::vector<tinyusdz::value::quath,_std::allocator<tinyusdz::value::quath>_>_>
                                                  ::type_id();
                                                  uVar2 = result.v_.vtable._4_4_;
                                                  if (uVar3 == uVar4) {
                                                    a_12 = Value::
                                                  as<std::vector<tinyusdz::value::quath,std::allocator<tinyusdz::value::quath>>>
                                                            (a,false);
                                                  c_25.
                                                  super__Vector_base<tinyusdz::value::quath,_std::allocator<tinyusdz::value::quath>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                       = (pointer)Value::
                                                  as<std::vector<tinyusdz::value::quath,std::allocator<tinyusdz::value::quath>>>
                                                            (b,false);
                                                  ::std::
                                                  vector<tinyusdz::value::quath,_std::allocator<tinyusdz::value::quath>_>
                                                  ::vector((
                                                  vector<tinyusdz::value::quath,_std::allocator<tinyusdz::value::quath>_>
                                                  *)local_580);
                                                  if ((a_12 != (
                                                  vector<tinyusdz::value::quath,_std::allocator<tinyusdz::value::quath>_>
                                                  *)0x0) && (c_25.
                                                  super__Vector_base<tinyusdz::value::quath,_std::allocator<tinyusdz::value::quath>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  != (pointer)0x0)) {
                                                    lerp<tinyusdz::value::quath>
                                                              ((
                                                  vector<tinyusdz::value::quath,_std::allocator<tinyusdz::value::quath>_>
                                                  *)&v0_26,a_12,
                                                  (
                                                  vector<tinyusdz::value::quath,_std::allocator<tinyusdz::value::quath>_>
                                                  *)c_25.
                                                  super__Vector_base<tinyusdz::value::quath,_std::allocator<tinyusdz::value::quath>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  ,dt);
                                                  ::std::
                                                  vector<tinyusdz::value::quath,_std::allocator<tinyusdz::value::quath>_>
                                                  ::operator=((
                                                  vector<tinyusdz::value::quath,_std::allocator<tinyusdz::value::quath>_>
                                                  *)local_580,
                                                  (
                                                  vector<tinyusdz::value::quath,_std::allocator<tinyusdz::value::quath>_>
                                                  *)&v0_26);
                                                  ::std::
                                                  vector<tinyusdz::value::quath,_std::allocator<tinyusdz::value::quath>_>
                                                  ::~vector((
                                                  vector<tinyusdz::value::quath,_std::allocator<tinyusdz::value::quath>_>
                                                  *)&v0_26);
                                                  Value::operator=((Value *)&v0,
                                                                   (
                                                  vector<tinyusdz::value::quath,_std::allocator<tinyusdz::value::quath>_>
                                                  *)local_580);
                                                  result.v_.vtable._3_1_ = 1;
                                                  }
                                                  ::std::
                                                  vector<tinyusdz::value::quath,_std::allocator<tinyusdz::value::quath>_>
                                                  ::~vector((
                                                  vector<tinyusdz::value::quath,_std::allocator<tinyusdz::value::quath>_>
                                                  *)local_580);
                                                  }
                                                  else {
                                                    uVar4 = TypeTraits<tinyusdz::value::quatf>::
                                                            type_id();
                                                    uVar3 = result.v_.vtable._4_4_;
                                                    if (uVar2 == uVar4) {
                                                      a_13 = Value::as<tinyusdz::value::quatf>
                                                                       (a,false);
                                                      c_26._8_8_ = Value::as<tinyusdz::value::quatf>
                                                                             (b,false);
                                                      if ((a_13 != (quatf *)0x0) &&
                                                         ((quatf *)c_26._8_8_ != (quatf *)0x0)) {
                                                        qVar20 = lerp<tinyusdz::value::quatf>
                                                                           (a_13,(quatf *)c_26._8_8_
                                                                            ,dt);
                                                        v0_27 = qVar20.imag._M_elems._0_8_;
                                                        local_5b8 = v0_27;
                                                        local_5c0 = qVar20._8_8_;
                                                        c_26.imag._M_elems[0] = local_5c0[0];
                                                        c_26.imag._M_elems[1] = local_5c0[1];
                                                        Value::operator=((Value *)&v0,
                                                                         (quatf *)&local_5b8);
                                                        result.v_.vtable._3_1_ = 1;
                                                      }
                                                    }
                                                    else {
                                                      uVar4 = 
                                                  TypeTraits<std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>_>
                                                  ::type_id();
                                                  uVar2 = result.v_.vtable._4_4_;
                                                  if (uVar3 == uVar4) {
                                                    a_14 = Value::
                                                  as<std::vector<tinyusdz::value::quatf,std::allocator<tinyusdz::value::quatf>>>
                                                            (a,false);
                                                  c_27.
                                                  super__Vector_base<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                       = (pointer)Value::
                                                  as<std::vector<tinyusdz::value::quatf,std::allocator<tinyusdz::value::quatf>>>
                                                            (b,false);
                                                  ::std::
                                                  vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>
                                                  ::vector((
                                                  vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>
                                                  *)local_5f0);
                                                  if ((a_14 != (
                                                  vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>
                                                  *)0x0) && (c_27.
                                                  super__Vector_base<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  != (pointer)0x0)) {
                                                    lerp<tinyusdz::value::quatf>
                                                              ((
                                                  vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>
                                                  *)&v0_28,a_14,
                                                  (
                                                  vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>
                                                  *)c_27.
                                                  super__Vector_base<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  ,dt);
                                                  ::std::
                                                  vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>
                                                  ::operator=((
                                                  vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>
                                                  *)local_5f0,
                                                  (
                                                  vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>
                                                  *)&v0_28);
                                                  ::std::
                                                  vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>
                                                  ::~vector((
                                                  vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>
                                                  *)&v0_28);
                                                  Value::operator=((Value *)&v0,
                                                                   (
                                                  vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>
                                                  *)local_5f0);
                                                  result.v_.vtable._3_1_ = 1;
                                                  }
                                                  ::std::
                                                  vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>
                                                  ::~vector((
                                                  vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>
                                                  *)local_5f0);
                                                  }
                                                  else {
                                                    uVar4 = TypeTraits<tinyusdz::value::quatd>::
                                                            type_id();
                                                    uVar3 = result.v_.vtable._4_4_;
                                                    if (uVar2 == uVar4) {
                                                      a_15 = Value::as<tinyusdz::value::quatd>
                                                                       (a,false);
                                                      c_28.real = (double)Value::
                                                  as<tinyusdz::value::quatd>(b,false);
                                                  if ((a_15 != (quatd *)0x0) &&
                                                     ((quatd *)c_28.real != (quatd *)0x0)) {
                                                    lerp<tinyusdz::value::quatd>
                                                              ((quatd *)&v0_29,a_15,
                                                               (quatd *)c_28.real,dt);
                                                    local_638 = (undefined1  [8])v0_29;
                                                    c_28.imag._M_elems[0] = local_650;
                                                    c_28.imag._M_elems[1] = local_648;
                                                    c_28.imag._M_elems[2] = local_640;
                                                    Value::operator=((Value *)&v0,(quatd *)local_638
                                                                    );
                                                    result.v_.vtable._3_1_ = 1;
                                                  }
                                                  }
                                                  else {
                                                    uVar4 = 
                                                  TypeTraits<std::vector<tinyusdz::value::quatd,_std::allocator<tinyusdz::value::quatd>_>_>
                                                  ::type_id();
                                                  uVar2 = result.v_.vtable._4_4_;
                                                  if (uVar3 == uVar4) {
                                                    a_16 = Value::
                                                  as<std::vector<tinyusdz::value::quatd,std::allocator<tinyusdz::value::quatd>>>
                                                            (a,false);
                                                  c_29.
                                                  super__Vector_base<tinyusdz::value::quatd,_std::allocator<tinyusdz::value::quatd>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                       = (pointer)Value::
                                                  as<std::vector<tinyusdz::value::quatd,std::allocator<tinyusdz::value::quatd>>>
                                                            (b,false);
                                                  ::std::
                                                  vector<tinyusdz::value::quatd,_std::allocator<tinyusdz::value::quatd>_>
                                                  ::vector((
                                                  vector<tinyusdz::value::quatd,_std::allocator<tinyusdz::value::quatd>_>
                                                  *)local_680);
                                                  if ((a_16 != (
                                                  vector<tinyusdz::value::quatd,_std::allocator<tinyusdz::value::quatd>_>
                                                  *)0x0) && (c_29.
                                                  super__Vector_base<tinyusdz::value::quatd,_std::allocator<tinyusdz::value::quatd>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  != (pointer)0x0)) {
                                                    lerp<tinyusdz::value::quatd>
                                                              ((
                                                  vector<tinyusdz::value::quatd,_std::allocator<tinyusdz::value::quatd>_>
                                                  *)&v0_30,a_16,
                                                  (
                                                  vector<tinyusdz::value::quatd,_std::allocator<tinyusdz::value::quatd>_>
                                                  *)c_29.
                                                  super__Vector_base<tinyusdz::value::quatd,_std::allocator<tinyusdz::value::quatd>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  ,dt);
                                                  ::std::
                                                  vector<tinyusdz::value::quatd,_std::allocator<tinyusdz::value::quatd>_>
                                                  ::operator=((
                                                  vector<tinyusdz::value::quatd,_std::allocator<tinyusdz::value::quatd>_>
                                                  *)local_680,
                                                  (
                                                  vector<tinyusdz::value::quatd,_std::allocator<tinyusdz::value::quatd>_>
                                                  *)&v0_30);
                                                  ::std::
                                                  vector<tinyusdz::value::quatd,_std::allocator<tinyusdz::value::quatd>_>
                                                  ::~vector((
                                                  vector<tinyusdz::value::quatd,_std::allocator<tinyusdz::value::quatd>_>
                                                  *)&v0_30);
                                                  Value::operator=((Value *)&v0,
                                                                   (
                                                  vector<tinyusdz::value::quatd,_std::allocator<tinyusdz::value::quatd>_>
                                                  *)local_680);
                                                  result.v_.vtable._3_1_ = 1;
                                                  }
                                                  ::std::
                                                  vector<tinyusdz::value::quatd,_std::allocator<tinyusdz::value::quatd>_>
                                                  ::~vector((
                                                  vector<tinyusdz::value::quatd,_std::allocator<tinyusdz::value::quatd>_>
                                                  *)local_680);
                                                  }
                                                  else {
                                                    uVar4 = TypeTraits<tinyusdz::value::color3h>::
                                                            type_id();
                                                    uVar3 = result.v_.vtable._4_4_;
                                                    if (uVar2 == uVar4) {
                                                      a_17 = Value::as<tinyusdz::value::color3h>
                                                                       (a,false);
                                                      pcStack_6a8 = Value::
                                                  as<tinyusdz::value::color3h>(b,false);
                                                  if ((a_17 != (color3h *)0x0) &&
                                                     (pcStack_6a8 != (color3h *)0x0)) {
                                                    cVar6 = lerp<tinyusdz::value::color3h>
                                                                      (a_17,pcStack_6a8,dt);
                                                    local_6ae._0_4_ = cVar6._0_4_;
                                                    local_6ae.b = cVar6.b.value;
                                                    Value::operator=((Value *)&v0,&local_6ae);
                                                    result.v_.vtable._3_1_ = 1;
                                                  }
                                                  }
                                                  else {
                                                    uVar4 = 
                                                  TypeTraits<std::vector<tinyusdz::value::color3h,_std::allocator<tinyusdz::value::color3h>_>_>
                                                  ::type_id();
                                                  uVar2 = result.v_.vtable._4_4_;
                                                  if (uVar3 == uVar4) {
                                                    a_18 = Value::
                                                  as<std::vector<tinyusdz::value::color3h,std::allocator<tinyusdz::value::color3h>>>
                                                            (a,false);
                                                  c_31.
                                                  super__Vector_base<tinyusdz::value::color3h,_std::allocator<tinyusdz::value::color3h>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                       = (pointer)Value::
                                                  as<std::vector<tinyusdz::value::color3h,std::allocator<tinyusdz::value::color3h>>>
                                                            (b,false);
                                                  ::std::
                                                  vector<tinyusdz::value::color3h,_std::allocator<tinyusdz::value::color3h>_>
                                                  ::vector((
                                                  vector<tinyusdz::value::color3h,_std::allocator<tinyusdz::value::color3h>_>
                                                  *)local_6e0);
                                                  if ((a_18 != (
                                                  vector<tinyusdz::value::color3h,_std::allocator<tinyusdz::value::color3h>_>
                                                  *)0x0) && (c_31.
                                                  super__Vector_base<tinyusdz::value::color3h,_std::allocator<tinyusdz::value::color3h>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  != (pointer)0x0)) {
                                                    lerp<tinyusdz::value::color3h>
                                                              ((
                                                  vector<tinyusdz::value::color3h,_std::allocator<tinyusdz::value::color3h>_>
                                                  *)&v0_32,a_18,
                                                  (
                                                  vector<tinyusdz::value::color3h,_std::allocator<tinyusdz::value::color3h>_>
                                                  *)c_31.
                                                  super__Vector_base<tinyusdz::value::color3h,_std::allocator<tinyusdz::value::color3h>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  ,dt);
                                                  ::std::
                                                  vector<tinyusdz::value::color3h,_std::allocator<tinyusdz::value::color3h>_>
                                                  ::operator=((
                                                  vector<tinyusdz::value::color3h,_std::allocator<tinyusdz::value::color3h>_>
                                                  *)local_6e0,
                                                  (
                                                  vector<tinyusdz::value::color3h,_std::allocator<tinyusdz::value::color3h>_>
                                                  *)&v0_32);
                                                  ::std::
                                                  vector<tinyusdz::value::color3h,_std::allocator<tinyusdz::value::color3h>_>
                                                  ::~vector((
                                                  vector<tinyusdz::value::color3h,_std::allocator<tinyusdz::value::color3h>_>
                                                  *)&v0_32);
                                                  Value::operator=((Value *)&v0,
                                                                   (
                                                  vector<tinyusdz::value::color3h,_std::allocator<tinyusdz::value::color3h>_>
                                                  *)local_6e0);
                                                  result.v_.vtable._3_1_ = 1;
                                                  }
                                                  ::std::
                                                  vector<tinyusdz::value::color3h,_std::allocator<tinyusdz::value::color3h>_>
                                                  ::~vector((
                                                  vector<tinyusdz::value::color3h,_std::allocator<tinyusdz::value::color3h>_>
                                                  *)local_6e0);
                                                  }
                                                  else {
                                                    uVar4 = TypeTraits<tinyusdz::value::color3f>::
                                                            type_id();
                                                    uVar3 = result.v_.vtable._4_4_;
                                                    if (uVar2 == uVar4) {
                                                      a_19 = Value::as<tinyusdz::value::color3f>
                                                                       (a,false);
                                                      c_32._4_8_ = Value::
                                                  as<tinyusdz::value::color3f>(b,false);
                                                  if ((a_19 != (color3f *)0x0) &&
                                                     ((color3f *)c_32._4_8_ != (color3f *)0x0)) {
                                                    cVar13 = lerp<tinyusdz::value::color3f>
                                                                       (a_19,(color3f *)c_32._4_8_,
                                                                        dt);
                                                    v0_33 = cVar13._0_8_;
                                                    local_728 = cVar13.b;
                                                    local_714 = v0_33;
                                                    c_32.r = local_728;
                                                    Value::operator=((Value *)&v0,
                                                                     (color3f *)&local_714);
                                                    result.v_.vtable._3_1_ = 1;
                                                  }
                                                  }
                                                  else {
                                                    uVar4 = 
                                                  TypeTraits<std::vector<tinyusdz::value::color3f,_std::allocator<tinyusdz::value::color3f>_>_>
                                                  ::type_id();
                                                  uVar2 = result.v_.vtable._4_4_;
                                                  if (uVar3 == uVar4) {
                                                    a_20 = Value::
                                                  as<std::vector<tinyusdz::value::color3f,std::allocator<tinyusdz::value::color3f>>>
                                                            (a,false);
                                                  c_33.
                                                  super__Vector_base<tinyusdz::value::color3f,_std::allocator<tinyusdz::value::color3f>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                       = (pointer)Value::
                                                  as<std::vector<tinyusdz::value::color3f,std::allocator<tinyusdz::value::color3f>>>
                                                            (b,false);
                                                  ::std::
                                                  vector<tinyusdz::value::color3f,_std::allocator<tinyusdz::value::color3f>_>
                                                  ::vector((
                                                  vector<tinyusdz::value::color3f,_std::allocator<tinyusdz::value::color3f>_>
                                                  *)local_758);
                                                  if ((a_20 != (
                                                  vector<tinyusdz::value::color3f,_std::allocator<tinyusdz::value::color3f>_>
                                                  *)0x0) && (c_33.
                                                  super__Vector_base<tinyusdz::value::color3f,_std::allocator<tinyusdz::value::color3f>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  != (pointer)0x0)) {
                                                    lerp<tinyusdz::value::color3f>
                                                              ((
                                                  vector<tinyusdz::value::color3f,_std::allocator<tinyusdz::value::color3f>_>
                                                  *)&v0_34,a_20,
                                                  (
                                                  vector<tinyusdz::value::color3f,_std::allocator<tinyusdz::value::color3f>_>
                                                  *)c_33.
                                                  super__Vector_base<tinyusdz::value::color3f,_std::allocator<tinyusdz::value::color3f>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  ,dt);
                                                  ::std::
                                                  vector<tinyusdz::value::color3f,_std::allocator<tinyusdz::value::color3f>_>
                                                  ::operator=((
                                                  vector<tinyusdz::value::color3f,_std::allocator<tinyusdz::value::color3f>_>
                                                  *)local_758,
                                                  (
                                                  vector<tinyusdz::value::color3f,_std::allocator<tinyusdz::value::color3f>_>
                                                  *)&v0_34);
                                                  ::std::
                                                  vector<tinyusdz::value::color3f,_std::allocator<tinyusdz::value::color3f>_>
                                                  ::~vector((
                                                  vector<tinyusdz::value::color3f,_std::allocator<tinyusdz::value::color3f>_>
                                                  *)&v0_34);
                                                  Value::operator=((Value *)&v0,
                                                                   (
                                                  vector<tinyusdz::value::color3f,_std::allocator<tinyusdz::value::color3f>_>
                                                  *)local_758);
                                                  result.v_.vtable._3_1_ = 1;
                                                  }
                                                  ::std::
                                                  vector<tinyusdz::value::color3f,_std::allocator<tinyusdz::value::color3f>_>
                                                  ::~vector((
                                                  vector<tinyusdz::value::color3f,_std::allocator<tinyusdz::value::color3f>_>
                                                  *)local_758);
                                                  }
                                                  else {
                                                    uVar4 = TypeTraits<tinyusdz::value::color3d>::
                                                            type_id();
                                                    uVar3 = result.v_.vtable._4_4_;
                                                    if (uVar2 == uVar4) {
                                                      a_21 = Value::as<tinyusdz::value::color3d>
                                                                       (a,false);
                                                      c_34.b = (double)Value::
                                                  as<tinyusdz::value::color3d>(b,false);
                                                  if ((a_21 != (color3d *)0x0) &&
                                                     ((color3d *)c_34.b != (color3d *)0x0)) {
                                                    lerp<tinyusdz::value::color3d>
                                                              ((color3d *)&v0_35,a_21,
                                                               (color3d *)c_34.b,dt);
                                                    local_798 = (undefined1  [8])v0_35;
                                                    c_34.r = local_7a8;
                                                    c_34.g = local_7a0;
                                                    Value::operator=((Value *)&v0,
                                                                     (color3d *)local_798);
                                                    result.v_.vtable._3_1_ = 1;
                                                  }
                                                  }
                                                  else {
                                                    uVar4 = 
                                                  TypeTraits<std::vector<tinyusdz::value::color3d,_std::allocator<tinyusdz::value::color3d>_>_>
                                                  ::type_id();
                                                  uVar2 = result.v_.vtable._4_4_;
                                                  if (uVar3 == uVar4) {
                                                    a_22 = Value::
                                                  as<std::vector<tinyusdz::value::color3d,std::allocator<tinyusdz::value::color3d>>>
                                                            (a,false);
                                                  c_35.
                                                  super__Vector_base<tinyusdz::value::color3d,_std::allocator<tinyusdz::value::color3d>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                       = (pointer)Value::
                                                  as<std::vector<tinyusdz::value::color3d,std::allocator<tinyusdz::value::color3d>>>
                                                            (b,false);
                                                  ::std::
                                                  vector<tinyusdz::value::color3d,_std::allocator<tinyusdz::value::color3d>_>
                                                  ::vector((
                                                  vector<tinyusdz::value::color3d,_std::allocator<tinyusdz::value::color3d>_>
                                                  *)local_7d8);
                                                  if ((a_22 != (
                                                  vector<tinyusdz::value::color3d,_std::allocator<tinyusdz::value::color3d>_>
                                                  *)0x0) && (c_35.
                                                  super__Vector_base<tinyusdz::value::color3d,_std::allocator<tinyusdz::value::color3d>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  != (pointer)0x0)) {
                                                    lerp<tinyusdz::value::color3d>
                                                              ((
                                                  vector<tinyusdz::value::color3d,_std::allocator<tinyusdz::value::color3d>_>
                                                  *)&v0_36,a_22,
                                                  (
                                                  vector<tinyusdz::value::color3d,_std::allocator<tinyusdz::value::color3d>_>
                                                  *)c_35.
                                                  super__Vector_base<tinyusdz::value::color3d,_std::allocator<tinyusdz::value::color3d>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  ,dt);
                                                  ::std::
                                                  vector<tinyusdz::value::color3d,_std::allocator<tinyusdz::value::color3d>_>
                                                  ::operator=((
                                                  vector<tinyusdz::value::color3d,_std::allocator<tinyusdz::value::color3d>_>
                                                  *)local_7d8,
                                                  (
                                                  vector<tinyusdz::value::color3d,_std::allocator<tinyusdz::value::color3d>_>
                                                  *)&v0_36);
                                                  ::std::
                                                  vector<tinyusdz::value::color3d,_std::allocator<tinyusdz::value::color3d>_>
                                                  ::~vector((
                                                  vector<tinyusdz::value::color3d,_std::allocator<tinyusdz::value::color3d>_>
                                                  *)&v0_36);
                                                  Value::operator=((Value *)&v0,
                                                                   (
                                                  vector<tinyusdz::value::color3d,_std::allocator<tinyusdz::value::color3d>_>
                                                  *)local_7d8);
                                                  result.v_.vtable._3_1_ = 1;
                                                  }
                                                  ::std::
                                                  vector<tinyusdz::value::color3d,_std::allocator<tinyusdz::value::color3d>_>
                                                  ::~vector((
                                                  vector<tinyusdz::value::color3d,_std::allocator<tinyusdz::value::color3d>_>
                                                  *)local_7d8);
                                                  }
                                                  else {
                                                    uVar4 = TypeTraits<tinyusdz::value::color4h>::
                                                            type_id();
                                                    uVar3 = result.v_.vtable._4_4_;
                                                    if (uVar2 == uVar4) {
                                                      a_23 = Value::as<tinyusdz::value::color4h>
                                                                       (a,false);
                                                      c_36 = (color4h)Value::
                                                  as<tinyusdz::value::color4h>(b,false);
                                                  if ((a_23 != (color4h *)0x0) &&
                                                     (c_36 != (color4h)0x0)) {
                                                    local_808 = lerp<tinyusdz::value::color4h>
                                                                          (a_23,(color4h *)c_36,dt);
                                                    Value::operator=((Value *)&v0,&local_808);
                                                    result.v_.vtable._3_1_ = 1;
                                                  }
                                                  }
                                                  else {
                                                    uVar4 = 
                                                  TypeTraits<std::vector<tinyusdz::value::color4h,_std::allocator<tinyusdz::value::color4h>_>_>
                                                  ::type_id();
                                                  uVar2 = result.v_.vtable._4_4_;
                                                  if (uVar3 == uVar4) {
                                                    a_24 = Value::
                                                  as<std::vector<tinyusdz::value::color4h,std::allocator<tinyusdz::value::color4h>>>
                                                            (a,false);
                                                  c_37.
                                                  super__Vector_base<tinyusdz::value::color4h,_std::allocator<tinyusdz::value::color4h>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                       = (pointer)Value::
                                                  as<std::vector<tinyusdz::value::color4h,std::allocator<tinyusdz::value::color4h>>>
                                                            (b,false);
                                                  ::std::
                                                  vector<tinyusdz::value::color4h,_std::allocator<tinyusdz::value::color4h>_>
                                                  ::vector((
                                                  vector<tinyusdz::value::color4h,_std::allocator<tinyusdz::value::color4h>_>
                                                  *)local_838);
                                                  if ((a_24 != (
                                                  vector<tinyusdz::value::color4h,_std::allocator<tinyusdz::value::color4h>_>
                                                  *)0x0) && (c_37.
                                                  super__Vector_base<tinyusdz::value::color4h,_std::allocator<tinyusdz::value::color4h>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  != (pointer)0x0)) {
                                                    lerp<tinyusdz::value::color4h>
                                                              ((
                                                  vector<tinyusdz::value::color4h,_std::allocator<tinyusdz::value::color4h>_>
                                                  *)&v0_38,a_24,
                                                  (
                                                  vector<tinyusdz::value::color4h,_std::allocator<tinyusdz::value::color4h>_>
                                                  *)c_37.
                                                  super__Vector_base<tinyusdz::value::color4h,_std::allocator<tinyusdz::value::color4h>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  ,dt);
                                                  ::std::
                                                  vector<tinyusdz::value::color4h,_std::allocator<tinyusdz::value::color4h>_>
                                                  ::operator=((
                                                  vector<tinyusdz::value::color4h,_std::allocator<tinyusdz::value::color4h>_>
                                                  *)local_838,
                                                  (
                                                  vector<tinyusdz::value::color4h,_std::allocator<tinyusdz::value::color4h>_>
                                                  *)&v0_38);
                                                  ::std::
                                                  vector<tinyusdz::value::color4h,_std::allocator<tinyusdz::value::color4h>_>
                                                  ::~vector((
                                                  vector<tinyusdz::value::color4h,_std::allocator<tinyusdz::value::color4h>_>
                                                  *)&v0_38);
                                                  Value::operator=((Value *)&v0,
                                                                   (
                                                  vector<tinyusdz::value::color4h,_std::allocator<tinyusdz::value::color4h>_>
                                                  *)local_838);
                                                  result.v_.vtable._3_1_ = 1;
                                                  }
                                                  ::std::
                                                  vector<tinyusdz::value::color4h,_std::allocator<tinyusdz::value::color4h>_>
                                                  ::~vector((
                                                  vector<tinyusdz::value::color4h,_std::allocator<tinyusdz::value::color4h>_>
                                                  *)local_838);
                                                  }
                                                  else {
                                                    uVar4 = TypeTraits<tinyusdz::value::color4f>::
                                                            type_id();
                                                    uVar3 = result.v_.vtable._4_4_;
                                                    if (uVar2 == uVar4) {
                                                      a_25 = Value::as<tinyusdz::value::color4f>
                                                                       (a,false);
                                                      c_38._8_8_ = Value::
                                                  as<tinyusdz::value::color4f>(b,false);
                                                  if ((a_25 != (color4f *)0x0) &&
                                                     ((color4f *)c_38._8_8_ != (color4f *)0x0)) {
                                                    cVar21 = lerp<tinyusdz::value::color4f>
                                                                       (a_25,(color4f *)c_38._8_8_,
                                                                        dt);
                                                    v0_39 = cVar21._0_8_;
                                                    local_870 = (undefined1  [8])v0_39;
                                                    local_878 = cVar21._8_8_;
                                                    c_38.r = (float)local_878._0_4_;
                                                    c_38.g = (float)local_878._4_4_;
                                                    Value::operator=((Value *)&v0,
                                                                     (color4f *)local_870);
                                                    result.v_.vtable._3_1_ = 1;
                                                  }
                                                  }
                                                  else {
                                                    uVar4 = 
                                                  TypeTraits<std::vector<tinyusdz::value::color4f,_std::allocator<tinyusdz::value::color4f>_>_>
                                                  ::type_id();
                                                  uVar2 = result.v_.vtable._4_4_;
                                                  if (uVar3 == uVar4) {
                                                    a_26 = Value::
                                                  as<std::vector<tinyusdz::value::color4f,std::allocator<tinyusdz::value::color4f>>>
                                                            (a,false);
                                                  c_39.
                                                  super__Vector_base<tinyusdz::value::color4f,_std::allocator<tinyusdz::value::color4f>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                       = (pointer)Value::
                                                  as<std::vector<tinyusdz::value::color4f,std::allocator<tinyusdz::value::color4f>>>
                                                            (b,false);
                                                  ::std::
                                                  vector<tinyusdz::value::color4f,_std::allocator<tinyusdz::value::color4f>_>
                                                  ::vector((
                                                  vector<tinyusdz::value::color4f,_std::allocator<tinyusdz::value::color4f>_>
                                                  *)local_8a8);
                                                  if ((a_26 != (
                                                  vector<tinyusdz::value::color4f,_std::allocator<tinyusdz::value::color4f>_>
                                                  *)0x0) && (c_39.
                                                  super__Vector_base<tinyusdz::value::color4f,_std::allocator<tinyusdz::value::color4f>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  != (pointer)0x0)) {
                                                    lerp<tinyusdz::value::color4f>
                                                              ((
                                                  vector<tinyusdz::value::color4f,_std::allocator<tinyusdz::value::color4f>_>
                                                  *)&v0_40,a_26,
                                                  (
                                                  vector<tinyusdz::value::color4f,_std::allocator<tinyusdz::value::color4f>_>
                                                  *)c_39.
                                                  super__Vector_base<tinyusdz::value::color4f,_std::allocator<tinyusdz::value::color4f>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  ,dt);
                                                  ::std::
                                                  vector<tinyusdz::value::color4f,_std::allocator<tinyusdz::value::color4f>_>
                                                  ::operator=((
                                                  vector<tinyusdz::value::color4f,_std::allocator<tinyusdz::value::color4f>_>
                                                  *)local_8a8,
                                                  (
                                                  vector<tinyusdz::value::color4f,_std::allocator<tinyusdz::value::color4f>_>
                                                  *)&v0_40);
                                                  ::std::
                                                  vector<tinyusdz::value::color4f,_std::allocator<tinyusdz::value::color4f>_>
                                                  ::~vector((
                                                  vector<tinyusdz::value::color4f,_std::allocator<tinyusdz::value::color4f>_>
                                                  *)&v0_40);
                                                  Value::operator=((Value *)&v0,
                                                                   (
                                                  vector<tinyusdz::value::color4f,_std::allocator<tinyusdz::value::color4f>_>
                                                  *)local_8a8);
                                                  result.v_.vtable._3_1_ = 1;
                                                  }
                                                  ::std::
                                                  vector<tinyusdz::value::color4f,_std::allocator<tinyusdz::value::color4f>_>
                                                  ::~vector((
                                                  vector<tinyusdz::value::color4f,_std::allocator<tinyusdz::value::color4f>_>
                                                  *)local_8a8);
                                                  }
                                                  else {
                                                    uVar4 = TypeTraits<tinyusdz::value::color4d>::
                                                            type_id();
                                                    uVar3 = result.v_.vtable._4_4_;
                                                    if (uVar2 == uVar4) {
                                                      a_27 = Value::as<tinyusdz::value::color4d>
                                                                       (a,false);
                                                      c_40.a = (double)Value::
                                                  as<tinyusdz::value::color4d>(b,false);
                                                  if ((a_27 != (color4d *)0x0) &&
                                                     ((color4d *)c_40.a != (color4d *)0x0)) {
                                                    lerp<tinyusdz::value::color4d>
                                                              ((color4d *)&v0_41,a_27,
                                                               (color4d *)c_40.a,dt);
                                                    local_8f0 = (undefined1  [8])v0_41;
                                                    c_40.r = local_908;
                                                    c_40.g = local_900;
                                                    c_40.b = local_8f8;
                                                    Value::operator=((Value *)&v0,
                                                                     (color4d *)local_8f0);
                                                    result.v_.vtable._3_1_ = 1;
                                                  }
                                                  }
                                                  else {
                                                    uVar4 = 
                                                  TypeTraits<std::vector<tinyusdz::value::color4d,_std::allocator<tinyusdz::value::color4d>_>_>
                                                  ::type_id();
                                                  uVar2 = result.v_.vtable._4_4_;
                                                  if (uVar3 == uVar4) {
                                                    a_28 = Value::
                                                  as<std::vector<tinyusdz::value::color4d,std::allocator<tinyusdz::value::color4d>>>
                                                            (a,false);
                                                  c_41.
                                                  super__Vector_base<tinyusdz::value::color4d,_std::allocator<tinyusdz::value::color4d>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                       = (pointer)Value::
                                                  as<std::vector<tinyusdz::value::color4d,std::allocator<tinyusdz::value::color4d>>>
                                                            (b,false);
                                                  ::std::
                                                  vector<tinyusdz::value::color4d,_std::allocator<tinyusdz::value::color4d>_>
                                                  ::vector((
                                                  vector<tinyusdz::value::color4d,_std::allocator<tinyusdz::value::color4d>_>
                                                  *)local_938);
                                                  if ((a_28 != (
                                                  vector<tinyusdz::value::color4d,_std::allocator<tinyusdz::value::color4d>_>
                                                  *)0x0) && (c_41.
                                                  super__Vector_base<tinyusdz::value::color4d,_std::allocator<tinyusdz::value::color4d>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  != (pointer)0x0)) {
                                                    lerp<tinyusdz::value::color4d>
                                                              ((
                                                  vector<tinyusdz::value::color4d,_std::allocator<tinyusdz::value::color4d>_>
                                                  *)&v0_42,a_28,
                                                  (
                                                  vector<tinyusdz::value::color4d,_std::allocator<tinyusdz::value::color4d>_>
                                                  *)c_41.
                                                  super__Vector_base<tinyusdz::value::color4d,_std::allocator<tinyusdz::value::color4d>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  ,dt);
                                                  ::std::
                                                  vector<tinyusdz::value::color4d,_std::allocator<tinyusdz::value::color4d>_>
                                                  ::operator=((
                                                  vector<tinyusdz::value::color4d,_std::allocator<tinyusdz::value::color4d>_>
                                                  *)local_938,
                                                  (
                                                  vector<tinyusdz::value::color4d,_std::allocator<tinyusdz::value::color4d>_>
                                                  *)&v0_42);
                                                  ::std::
                                                  vector<tinyusdz::value::color4d,_std::allocator<tinyusdz::value::color4d>_>
                                                  ::~vector((
                                                  vector<tinyusdz::value::color4d,_std::allocator<tinyusdz::value::color4d>_>
                                                  *)&v0_42);
                                                  Value::operator=((Value *)&v0,
                                                                   (
                                                  vector<tinyusdz::value::color4d,_std::allocator<tinyusdz::value::color4d>_>
                                                  *)local_938);
                                                  result.v_.vtable._3_1_ = 1;
                                                  }
                                                  ::std::
                                                  vector<tinyusdz::value::color4d,_std::allocator<tinyusdz::value::color4d>_>
                                                  ::~vector((
                                                  vector<tinyusdz::value::color4d,_std::allocator<tinyusdz::value::color4d>_>
                                                  *)local_938);
                                                  }
                                                  else {
                                                    uVar4 = TypeTraits<tinyusdz::value::point3h>::
                                                            type_id();
                                                    uVar3 = result.v_.vtable._4_4_;
                                                    if (uVar2 == uVar4) {
                                                      a_29 = Value::as<tinyusdz::value::point3h>
                                                                       (a,false);
                                                      ppStack_960 = Value::
                                                  as<tinyusdz::value::point3h>(b,false);
                                                  if ((a_29 != (point3h *)0x0) &&
                                                     (ppStack_960 != (point3h *)0x0)) {
                                                    pVar7 = lerp<tinyusdz::value::point3h>
                                                                      (a_29,ppStack_960,dt);
                                                    local_966._0_4_ = pVar7._0_4_;
                                                    local_966.z = pVar7.z.value;
                                                    Value::operator=((Value *)&v0,&local_966);
                                                    result.v_.vtable._3_1_ = 1;
                                                  }
                                                  }
                                                  else {
                                                    uVar4 = 
                                                  TypeTraits<std::vector<tinyusdz::value::point3h,_std::allocator<tinyusdz::value::point3h>_>_>
                                                  ::type_id();
                                                  uVar2 = result.v_.vtable._4_4_;
                                                  if (uVar3 == uVar4) {
                                                    a_30 = Value::
                                                  as<std::vector<tinyusdz::value::point3h,std::allocator<tinyusdz::value::point3h>>>
                                                            (a,false);
                                                  c_43.
                                                  super__Vector_base<tinyusdz::value::point3h,_std::allocator<tinyusdz::value::point3h>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                       = (pointer)Value::
                                                  as<std::vector<tinyusdz::value::point3h,std::allocator<tinyusdz::value::point3h>>>
                                                            (b,false);
                                                  ::std::
                                                  vector<tinyusdz::value::point3h,_std::allocator<tinyusdz::value::point3h>_>
                                                  ::vector((
                                                  vector<tinyusdz::value::point3h,_std::allocator<tinyusdz::value::point3h>_>
                                                  *)local_998);
                                                  if ((a_30 != (
                                                  vector<tinyusdz::value::point3h,_std::allocator<tinyusdz::value::point3h>_>
                                                  *)0x0) && (c_43.
                                                  super__Vector_base<tinyusdz::value::point3h,_std::allocator<tinyusdz::value::point3h>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  != (pointer)0x0)) {
                                                    lerp<tinyusdz::value::point3h>
                                                              ((
                                                  vector<tinyusdz::value::point3h,_std::allocator<tinyusdz::value::point3h>_>
                                                  *)&v0_44,a_30,
                                                  (
                                                  vector<tinyusdz::value::point3h,_std::allocator<tinyusdz::value::point3h>_>
                                                  *)c_43.
                                                  super__Vector_base<tinyusdz::value::point3h,_std::allocator<tinyusdz::value::point3h>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  ,dt);
                                                  ::std::
                                                  vector<tinyusdz::value::point3h,_std::allocator<tinyusdz::value::point3h>_>
                                                  ::operator=((
                                                  vector<tinyusdz::value::point3h,_std::allocator<tinyusdz::value::point3h>_>
                                                  *)local_998,
                                                  (
                                                  vector<tinyusdz::value::point3h,_std::allocator<tinyusdz::value::point3h>_>
                                                  *)&v0_44);
                                                  ::std::
                                                  vector<tinyusdz::value::point3h,_std::allocator<tinyusdz::value::point3h>_>
                                                  ::~vector((
                                                  vector<tinyusdz::value::point3h,_std::allocator<tinyusdz::value::point3h>_>
                                                  *)&v0_44);
                                                  Value::operator=((Value *)&v0,
                                                                   (
                                                  vector<tinyusdz::value::point3h,_std::allocator<tinyusdz::value::point3h>_>
                                                  *)local_998);
                                                  result.v_.vtable._3_1_ = 1;
                                                  }
                                                  ::std::
                                                  vector<tinyusdz::value::point3h,_std::allocator<tinyusdz::value::point3h>_>
                                                  ::~vector((
                                                  vector<tinyusdz::value::point3h,_std::allocator<tinyusdz::value::point3h>_>
                                                  *)local_998);
                                                  }
                                                  else {
                                                    uVar4 = TypeTraits<tinyusdz::value::point3f>::
                                                            type_id();
                                                    uVar3 = result.v_.vtable._4_4_;
                                                    if (uVar2 == uVar4) {
                                                      a_31 = Value::as<tinyusdz::value::point3f>
                                                                       (a,false);
                                                      c_44._4_8_ = Value::
                                                  as<tinyusdz::value::point3f>(b,false);
                                                  if ((a_31 != (point3f *)0x0) &&
                                                     ((point3f *)c_44._4_8_ != (point3f *)0x0)) {
                                                    pVar14 = lerp<tinyusdz::value::point3f>
                                                                       (a_31,(point3f *)c_44._4_8_,
                                                                        dt);
                                                    v0_45 = pVar14._0_8_;
                                                    local_9e0 = pVar14.z;
                                                    local_9cc = v0_45;
                                                    c_44.x = local_9e0;
                                                    Value::operator=((Value *)&v0,
                                                                     (point3f *)&local_9cc);
                                                    result.v_.vtable._3_1_ = 1;
                                                  }
                                                  }
                                                  else {
                                                    uVar4 = 
                                                  TypeTraits<std::vector<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_>_>
                                                  ::type_id();
                                                  uVar2 = result.v_.vtable._4_4_;
                                                  if (uVar3 == uVar4) {
                                                    a_32 = Value::
                                                  as<std::vector<tinyusdz::value::point3f,std::allocator<tinyusdz::value::point3f>>>
                                                            (a,false);
                                                  c_45.
                                                  super__Vector_base<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                       = (pointer)Value::
                                                  as<std::vector<tinyusdz::value::point3f,std::allocator<tinyusdz::value::point3f>>>
                                                            (b,false);
                                                  ::std::
                                                  vector<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_>
                                                  ::vector((
                                                  vector<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_>
                                                  *)local_a10);
                                                  if ((a_32 != (
                                                  vector<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_>
                                                  *)0x0) && (c_45.
                                                  super__Vector_base<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  != (pointer)0x0)) {
                                                    lerp<tinyusdz::value::point3f>
                                                              ((
                                                  vector<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_>
                                                  *)&v0_46,a_32,
                                                  (
                                                  vector<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_>
                                                  *)c_45.
                                                  super__Vector_base<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  ,dt);
                                                  ::std::
                                                  vector<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_>
                                                  ::operator=((
                                                  vector<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_>
                                                  *)local_a10,
                                                  (
                                                  vector<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_>
                                                  *)&v0_46);
                                                  ::std::
                                                  vector<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_>
                                                  ::~vector((
                                                  vector<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_>
                                                  *)&v0_46);
                                                  Value::operator=((Value *)&v0,
                                                                   (
                                                  vector<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_>
                                                  *)local_a10);
                                                  result.v_.vtable._3_1_ = 1;
                                                  }
                                                  ::std::
                                                  vector<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_>
                                                  ::~vector((
                                                  vector<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_>
                                                  *)local_a10);
                                                  }
                                                  else {
                                                    uVar4 = TypeTraits<tinyusdz::value::point3d>::
                                                            type_id();
                                                    uVar3 = result.v_.vtable._4_4_;
                                                    if (uVar2 == uVar4) {
                                                      a_33 = Value::as<tinyusdz::value::point3d>
                                                                       (a,false);
                                                      c_46.z = (double)Value::
                                                  as<tinyusdz::value::point3d>(b,false);
                                                  if ((a_33 != (point3d *)0x0) &&
                                                     ((point3d *)c_46.z != (point3d *)0x0)) {
                                                    lerp<tinyusdz::value::point3d>
                                                              ((point3d *)&v0_47,a_33,
                                                               (point3d *)c_46.z,dt);
                                                    local_a50 = (undefined1  [8])v0_47;
                                                    c_46.x = local_a60;
                                                    c_46.y = local_a58;
                                                    Value::operator=((Value *)&v0,
                                                                     (point3d *)local_a50);
                                                    result.v_.vtable._3_1_ = 1;
                                                  }
                                                  }
                                                  else {
                                                    uVar4 = 
                                                  TypeTraits<std::vector<tinyusdz::value::point3d,_std::allocator<tinyusdz::value::point3d>_>_>
                                                  ::type_id();
                                                  uVar2 = result.v_.vtable._4_4_;
                                                  if (uVar3 == uVar4) {
                                                    a_34 = Value::
                                                  as<std::vector<tinyusdz::value::point3d,std::allocator<tinyusdz::value::point3d>>>
                                                            (a,false);
                                                  c_47.
                                                  super__Vector_base<tinyusdz::value::point3d,_std::allocator<tinyusdz::value::point3d>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                       = (pointer)Value::
                                                  as<std::vector<tinyusdz::value::point3d,std::allocator<tinyusdz::value::point3d>>>
                                                            (b,false);
                                                  ::std::
                                                  vector<tinyusdz::value::point3d,_std::allocator<tinyusdz::value::point3d>_>
                                                  ::vector((
                                                  vector<tinyusdz::value::point3d,_std::allocator<tinyusdz::value::point3d>_>
                                                  *)local_a90);
                                                  if ((a_34 != (
                                                  vector<tinyusdz::value::point3d,_std::allocator<tinyusdz::value::point3d>_>
                                                  *)0x0) && (c_47.
                                                  super__Vector_base<tinyusdz::value::point3d,_std::allocator<tinyusdz::value::point3d>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  != (pointer)0x0)) {
                                                    lerp<tinyusdz::value::point3d>
                                                              ((
                                                  vector<tinyusdz::value::point3d,_std::allocator<tinyusdz::value::point3d>_>
                                                  *)&v0_48,a_34,
                                                  (
                                                  vector<tinyusdz::value::point3d,_std::allocator<tinyusdz::value::point3d>_>
                                                  *)c_47.
                                                  super__Vector_base<tinyusdz::value::point3d,_std::allocator<tinyusdz::value::point3d>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  ,dt);
                                                  ::std::
                                                  vector<tinyusdz::value::point3d,_std::allocator<tinyusdz::value::point3d>_>
                                                  ::operator=((
                                                  vector<tinyusdz::value::point3d,_std::allocator<tinyusdz::value::point3d>_>
                                                  *)local_a90,
                                                  (
                                                  vector<tinyusdz::value::point3d,_std::allocator<tinyusdz::value::point3d>_>
                                                  *)&v0_48);
                                                  ::std::
                                                  vector<tinyusdz::value::point3d,_std::allocator<tinyusdz::value::point3d>_>
                                                  ::~vector((
                                                  vector<tinyusdz::value::point3d,_std::allocator<tinyusdz::value::point3d>_>
                                                  *)&v0_48);
                                                  Value::operator=((Value *)&v0,
                                                                   (
                                                  vector<tinyusdz::value::point3d,_std::allocator<tinyusdz::value::point3d>_>
                                                  *)local_a90);
                                                  result.v_.vtable._3_1_ = 1;
                                                  }
                                                  ::std::
                                                  vector<tinyusdz::value::point3d,_std::allocator<tinyusdz::value::point3d>_>
                                                  ::~vector((
                                                  vector<tinyusdz::value::point3d,_std::allocator<tinyusdz::value::point3d>_>
                                                  *)local_a90);
                                                  }
                                                  else {
                                                    uVar4 = TypeTraits<tinyusdz::value::normal3h>::
                                                            type_id();
                                                    uVar3 = result.v_.vtable._4_4_;
                                                    if (uVar2 == uVar4) {
                                                      a_35 = Value::as<tinyusdz::value::normal3h>
                                                                       (a,false);
                                                      pnStack_ab8 = Value::
                                                  as<tinyusdz::value::normal3h>(b,false);
                                                  if ((a_35 != (normal3h *)0x0) &&
                                                     (pnStack_ab8 != (normal3h *)0x0)) {
                                                    nVar8 = lerp<tinyusdz::value::normal3h>
                                                                      (a_35,pnStack_ab8,dt);
                                                    local_abe._0_4_ = nVar8._0_4_;
                                                    local_abe.z = nVar8.z.value;
                                                    Value::operator=((Value *)&v0,&local_abe);
                                                    result.v_.vtable._3_1_ = 1;
                                                  }
                                                  }
                                                  else {
                                                    uVar4 = 
                                                  TypeTraits<std::vector<tinyusdz::value::normal3h,_std::allocator<tinyusdz::value::normal3h>_>_>
                                                  ::type_id();
                                                  uVar2 = result.v_.vtable._4_4_;
                                                  if (uVar3 == uVar4) {
                                                    a_36 = Value::
                                                  as<std::vector<tinyusdz::value::normal3h,std::allocator<tinyusdz::value::normal3h>>>
                                                            (a,false);
                                                  c_49.
                                                  super__Vector_base<tinyusdz::value::normal3h,_std::allocator<tinyusdz::value::normal3h>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                       = (pointer)Value::
                                                  as<std::vector<tinyusdz::value::normal3h,std::allocator<tinyusdz::value::normal3h>>>
                                                            (b,false);
                                                  ::std::
                                                  vector<tinyusdz::value::normal3h,_std::allocator<tinyusdz::value::normal3h>_>
                                                  ::vector((
                                                  vector<tinyusdz::value::normal3h,_std::allocator<tinyusdz::value::normal3h>_>
                                                  *)local_af0);
                                                  if ((a_36 != (
                                                  vector<tinyusdz::value::normal3h,_std::allocator<tinyusdz::value::normal3h>_>
                                                  *)0x0) && (c_49.
                                                  super__Vector_base<tinyusdz::value::normal3h,_std::allocator<tinyusdz::value::normal3h>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  != (pointer)0x0)) {
                                                    lerp<tinyusdz::value::normal3h>
                                                              ((
                                                  vector<tinyusdz::value::normal3h,_std::allocator<tinyusdz::value::normal3h>_>
                                                  *)&v0_50,a_36,
                                                  (
                                                  vector<tinyusdz::value::normal3h,_std::allocator<tinyusdz::value::normal3h>_>
                                                  *)c_49.
                                                  super__Vector_base<tinyusdz::value::normal3h,_std::allocator<tinyusdz::value::normal3h>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  ,dt);
                                                  ::std::
                                                  vector<tinyusdz::value::normal3h,_std::allocator<tinyusdz::value::normal3h>_>
                                                  ::operator=((
                                                  vector<tinyusdz::value::normal3h,_std::allocator<tinyusdz::value::normal3h>_>
                                                  *)local_af0,
                                                  (
                                                  vector<tinyusdz::value::normal3h,_std::allocator<tinyusdz::value::normal3h>_>
                                                  *)&v0_50);
                                                  ::std::
                                                  vector<tinyusdz::value::normal3h,_std::allocator<tinyusdz::value::normal3h>_>
                                                  ::~vector((
                                                  vector<tinyusdz::value::normal3h,_std::allocator<tinyusdz::value::normal3h>_>
                                                  *)&v0_50);
                                                  Value::operator=((Value *)&v0,
                                                                   (
                                                  vector<tinyusdz::value::normal3h,_std::allocator<tinyusdz::value::normal3h>_>
                                                  *)local_af0);
                                                  result.v_.vtable._3_1_ = 1;
                                                  }
                                                  ::std::
                                                  vector<tinyusdz::value::normal3h,_std::allocator<tinyusdz::value::normal3h>_>
                                                  ::~vector((
                                                  vector<tinyusdz::value::normal3h,_std::allocator<tinyusdz::value::normal3h>_>
                                                  *)local_af0);
                                                  }
                                                  else {
                                                    uVar4 = TypeTraits<tinyusdz::value::normal3f>::
                                                            type_id();
                                                    uVar3 = result.v_.vtable._4_4_;
                                                    if (uVar2 == uVar4) {
                                                      a_37 = Value::as<tinyusdz::value::normal3f>
                                                                       (a,false);
                                                      c_50._4_8_ = Value::
                                                  as<tinyusdz::value::normal3f>(b,false);
                                                  if ((a_37 != (normal3f *)0x0) &&
                                                     ((normal3f *)c_50._4_8_ != (normal3f *)0x0)) {
                                                    nVar15 = lerp<tinyusdz::value::normal3f>
                                                                       (a_37,(normal3f *)c_50._4_8_,
                                                                        dt);
                                                    v0_51 = nVar15._0_8_;
                                                    local_b38 = nVar15.z;
                                                    local_b24 = v0_51;
                                                    c_50.x = local_b38;
                                                    Value::operator=((Value *)&v0,
                                                                     (normal3f *)&local_b24);
                                                    result.v_.vtable._3_1_ = 1;
                                                  }
                                                  }
                                                  else {
                                                    uVar4 = 
                                                  TypeTraits<std::vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>_>
                                                  ::type_id();
                                                  uVar2 = result.v_.vtable._4_4_;
                                                  if (uVar3 == uVar4) {
                                                    a_38 = Value::
                                                  as<std::vector<tinyusdz::value::normal3f,std::allocator<tinyusdz::value::normal3f>>>
                                                            (a,false);
                                                  c_51.
                                                  super__Vector_base<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                       = (pointer)Value::
                                                  as<std::vector<tinyusdz::value::normal3f,std::allocator<tinyusdz::value::normal3f>>>
                                                            (b,false);
                                                  ::std::
                                                  vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>
                                                  ::vector((
                                                  vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>
                                                  *)local_b68);
                                                  if ((a_38 != (
                                                  vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>
                                                  *)0x0) && (c_51.
                                                  super__Vector_base<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  != (pointer)0x0)) {
                                                    lerp<tinyusdz::value::normal3f>
                                                              ((
                                                  vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>
                                                  *)&v0_52,a_38,
                                                  (
                                                  vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>
                                                  *)c_51.
                                                  super__Vector_base<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  ,dt);
                                                  ::std::
                                                  vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>
                                                  ::operator=((
                                                  vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>
                                                  *)local_b68,
                                                  (
                                                  vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>
                                                  *)&v0_52);
                                                  ::std::
                                                  vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>
                                                  ::~vector((
                                                  vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>
                                                  *)&v0_52);
                                                  Value::operator=((Value *)&v0,
                                                                   (
                                                  vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>
                                                  *)local_b68);
                                                  result.v_.vtable._3_1_ = 1;
                                                  }
                                                  ::std::
                                                  vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>
                                                  ::~vector((
                                                  vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>
                                                  *)local_b68);
                                                  }
                                                  else {
                                                    uVar4 = TypeTraits<tinyusdz::value::normal3d>::
                                                            type_id();
                                                    uVar3 = result.v_.vtable._4_4_;
                                                    if (uVar2 == uVar4) {
                                                      a_39 = Value::as<tinyusdz::value::normal3d>
                                                                       (a,false);
                                                      c_52.z = (double)Value::
                                                  as<tinyusdz::value::normal3d>(b,false);
                                                  if ((a_39 != (normal3d *)0x0) &&
                                                     ((normal3d *)c_52.z != (normal3d *)0x0)) {
                                                    lerp<tinyusdz::value::normal3d>
                                                              ((normal3d *)&v0_53,a_39,
                                                               (normal3d *)c_52.z,dt);
                                                    local_ba8 = (undefined1  [8])v0_53;
                                                    c_52.x = local_bb8;
                                                    c_52.y = local_bb0;
                                                    Value::operator=((Value *)&v0,
                                                                     (normal3d *)local_ba8);
                                                    result.v_.vtable._3_1_ = 1;
                                                  }
                                                  }
                                                  else {
                                                    uVar4 = 
                                                  TypeTraits<std::vector<tinyusdz::value::normal3d,_std::allocator<tinyusdz::value::normal3d>_>_>
                                                  ::type_id();
                                                  uVar2 = result.v_.vtable._4_4_;
                                                  if (uVar3 == uVar4) {
                                                    a_40 = Value::
                                                  as<std::vector<tinyusdz::value::normal3d,std::allocator<tinyusdz::value::normal3d>>>
                                                            (a,false);
                                                  c_53.
                                                  super__Vector_base<tinyusdz::value::normal3d,_std::allocator<tinyusdz::value::normal3d>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                       = (pointer)Value::
                                                  as<std::vector<tinyusdz::value::normal3d,std::allocator<tinyusdz::value::normal3d>>>
                                                            (b,false);
                                                  ::std::
                                                  vector<tinyusdz::value::normal3d,_std::allocator<tinyusdz::value::normal3d>_>
                                                  ::vector((
                                                  vector<tinyusdz::value::normal3d,_std::allocator<tinyusdz::value::normal3d>_>
                                                  *)local_be8);
                                                  if ((a_40 != (
                                                  vector<tinyusdz::value::normal3d,_std::allocator<tinyusdz::value::normal3d>_>
                                                  *)0x0) && (c_53.
                                                  super__Vector_base<tinyusdz::value::normal3d,_std::allocator<tinyusdz::value::normal3d>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  != (pointer)0x0)) {
                                                    lerp<tinyusdz::value::normal3d>
                                                              ((
                                                  vector<tinyusdz::value::normal3d,_std::allocator<tinyusdz::value::normal3d>_>
                                                  *)&v0_54,a_40,
                                                  (
                                                  vector<tinyusdz::value::normal3d,_std::allocator<tinyusdz::value::normal3d>_>
                                                  *)c_53.
                                                  super__Vector_base<tinyusdz::value::normal3d,_std::allocator<tinyusdz::value::normal3d>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  ,dt);
                                                  ::std::
                                                  vector<tinyusdz::value::normal3d,_std::allocator<tinyusdz::value::normal3d>_>
                                                  ::operator=((
                                                  vector<tinyusdz::value::normal3d,_std::allocator<tinyusdz::value::normal3d>_>
                                                  *)local_be8,
                                                  (
                                                  vector<tinyusdz::value::normal3d,_std::allocator<tinyusdz::value::normal3d>_>
                                                  *)&v0_54);
                                                  ::std::
                                                  vector<tinyusdz::value::normal3d,_std::allocator<tinyusdz::value::normal3d>_>
                                                  ::~vector((
                                                  vector<tinyusdz::value::normal3d,_std::allocator<tinyusdz::value::normal3d>_>
                                                  *)&v0_54);
                                                  Value::operator=((Value *)&v0,
                                                                   (
                                                  vector<tinyusdz::value::normal3d,_std::allocator<tinyusdz::value::normal3d>_>
                                                  *)local_be8);
                                                  result.v_.vtable._3_1_ = 1;
                                                  }
                                                  ::std::
                                                  vector<tinyusdz::value::normal3d,_std::allocator<tinyusdz::value::normal3d>_>
                                                  ::~vector((
                                                  vector<tinyusdz::value::normal3d,_std::allocator<tinyusdz::value::normal3d>_>
                                                  *)local_be8);
                                                  }
                                                  else {
                                                    uVar4 = TypeTraits<tinyusdz::value::vector3h>::
                                                            type_id();
                                                    uVar3 = result.v_.vtable._4_4_;
                                                    if (uVar2 == uVar4) {
                                                      a_41 = Value::as<tinyusdz::value::vector3h>
                                                                       (a,false);
                                                      pvStack_c10 = Value::
                                                  as<tinyusdz::value::vector3h>(b,false);
                                                  if ((a_41 != (vector3h *)0x0) &&
                                                     (pvStack_c10 != (vector3h *)0x0)) {
                                                    vVar9 = lerp<tinyusdz::value::vector3h>
                                                                      (a_41,pvStack_c10,dt);
                                                    local_c16._0_4_ = vVar9._0_4_;
                                                    local_c16.z = vVar9.z.value;
                                                    Value::operator=((Value *)&v0,&local_c16);
                                                    result.v_.vtable._3_1_ = 1;
                                                  }
                                                  }
                                                  else {
                                                    uVar4 = 
                                                  TypeTraits<std::vector<tinyusdz::value::vector3h,_std::allocator<tinyusdz::value::vector3h>_>_>
                                                  ::type_id();
                                                  uVar2 = result.v_.vtable._4_4_;
                                                  if (uVar3 == uVar4) {
                                                    a_42 = Value::
                                                  as<std::vector<tinyusdz::value::vector3h,std::allocator<tinyusdz::value::vector3h>>>
                                                            (a,false);
                                                  c_55.
                                                  super__Vector_base<tinyusdz::value::vector3h,_std::allocator<tinyusdz::value::vector3h>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                       = (pointer)Value::
                                                  as<std::vector<tinyusdz::value::vector3h,std::allocator<tinyusdz::value::vector3h>>>
                                                            (b,false);
                                                  ::std::
                                                  vector<tinyusdz::value::vector3h,_std::allocator<tinyusdz::value::vector3h>_>
                                                  ::vector((
                                                  vector<tinyusdz::value::vector3h,_std::allocator<tinyusdz::value::vector3h>_>
                                                  *)local_c48);
                                                  if ((a_42 != (
                                                  vector<tinyusdz::value::vector3h,_std::allocator<tinyusdz::value::vector3h>_>
                                                  *)0x0) && (c_55.
                                                  super__Vector_base<tinyusdz::value::vector3h,_std::allocator<tinyusdz::value::vector3h>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  != (pointer)0x0)) {
                                                    lerp<tinyusdz::value::vector3h>
                                                              ((
                                                  vector<tinyusdz::value::vector3h,_std::allocator<tinyusdz::value::vector3h>_>
                                                  *)&v0_56,a_42,
                                                  (
                                                  vector<tinyusdz::value::vector3h,_std::allocator<tinyusdz::value::vector3h>_>
                                                  *)c_55.
                                                  super__Vector_base<tinyusdz::value::vector3h,_std::allocator<tinyusdz::value::vector3h>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  ,dt);
                                                  ::std::
                                                  vector<tinyusdz::value::vector3h,_std::allocator<tinyusdz::value::vector3h>_>
                                                  ::operator=((
                                                  vector<tinyusdz::value::vector3h,_std::allocator<tinyusdz::value::vector3h>_>
                                                  *)local_c48,
                                                  (
                                                  vector<tinyusdz::value::vector3h,_std::allocator<tinyusdz::value::vector3h>_>
                                                  *)&v0_56);
                                                  ::std::
                                                  vector<tinyusdz::value::vector3h,_std::allocator<tinyusdz::value::vector3h>_>
                                                  ::~vector((
                                                  vector<tinyusdz::value::vector3h,_std::allocator<tinyusdz::value::vector3h>_>
                                                  *)&v0_56);
                                                  Value::operator=((Value *)&v0,
                                                                   (
                                                  vector<tinyusdz::value::vector3h,_std::allocator<tinyusdz::value::vector3h>_>
                                                  *)local_c48);
                                                  result.v_.vtable._3_1_ = 1;
                                                  }
                                                  ::std::
                                                  vector<tinyusdz::value::vector3h,_std::allocator<tinyusdz::value::vector3h>_>
                                                  ::~vector((
                                                  vector<tinyusdz::value::vector3h,_std::allocator<tinyusdz::value::vector3h>_>
                                                  *)local_c48);
                                                  }
                                                  else {
                                                    uVar4 = TypeTraits<tinyusdz::value::vector3f>::
                                                            type_id();
                                                    uVar3 = result.v_.vtable._4_4_;
                                                    if (uVar2 == uVar4) {
                                                      a_43 = Value::as<tinyusdz::value::vector3f>
                                                                       (a,false);
                                                      c_56._4_8_ = Value::
                                                  as<tinyusdz::value::vector3f>(b,false);
                                                  if ((a_43 != (vector3f *)0x0) &&
                                                     ((vector3f *)c_56._4_8_ != (vector3f *)0x0)) {
                                                    vVar16 = lerp<tinyusdz::value::vector3f>
                                                                       (a_43,(vector3f *)c_56._4_8_,
                                                                        dt);
                                                    v0_57 = vVar16._0_8_;
                                                    local_c90 = vVar16.z;
                                                    local_c7c = v0_57;
                                                    c_56.x = local_c90;
                                                    Value::operator=((Value *)&v0,
                                                                     (vector3f *)&local_c7c);
                                                    result.v_.vtable._3_1_ = 1;
                                                  }
                                                  }
                                                  else {
                                                    uVar4 = 
                                                  TypeTraits<std::vector<tinyusdz::value::vector3f,_std::allocator<tinyusdz::value::vector3f>_>_>
                                                  ::type_id();
                                                  uVar2 = result.v_.vtable._4_4_;
                                                  if (uVar3 == uVar4) {
                                                    a_44 = Value::
                                                  as<std::vector<tinyusdz::value::vector3f,std::allocator<tinyusdz::value::vector3f>>>
                                                            (a,false);
                                                  c_57.
                                                  super__Vector_base<tinyusdz::value::vector3f,_std::allocator<tinyusdz::value::vector3f>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                       = (pointer)Value::
                                                  as<std::vector<tinyusdz::value::vector3f,std::allocator<tinyusdz::value::vector3f>>>
                                                            (b,false);
                                                  ::std::
                                                  vector<tinyusdz::value::vector3f,_std::allocator<tinyusdz::value::vector3f>_>
                                                  ::vector((
                                                  vector<tinyusdz::value::vector3f,_std::allocator<tinyusdz::value::vector3f>_>
                                                  *)local_cc0);
                                                  if ((a_44 != (
                                                  vector<tinyusdz::value::vector3f,_std::allocator<tinyusdz::value::vector3f>_>
                                                  *)0x0) && (c_57.
                                                  super__Vector_base<tinyusdz::value::vector3f,_std::allocator<tinyusdz::value::vector3f>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  != (pointer)0x0)) {
                                                    lerp<tinyusdz::value::vector3f>
                                                              ((
                                                  vector<tinyusdz::value::vector3f,_std::allocator<tinyusdz::value::vector3f>_>
                                                  *)&v0_58,a_44,
                                                  (
                                                  vector<tinyusdz::value::vector3f,_std::allocator<tinyusdz::value::vector3f>_>
                                                  *)c_57.
                                                  super__Vector_base<tinyusdz::value::vector3f,_std::allocator<tinyusdz::value::vector3f>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  ,dt);
                                                  ::std::
                                                  vector<tinyusdz::value::vector3f,_std::allocator<tinyusdz::value::vector3f>_>
                                                  ::operator=((
                                                  vector<tinyusdz::value::vector3f,_std::allocator<tinyusdz::value::vector3f>_>
                                                  *)local_cc0,
                                                  (
                                                  vector<tinyusdz::value::vector3f,_std::allocator<tinyusdz::value::vector3f>_>
                                                  *)&v0_58);
                                                  ::std::
                                                  vector<tinyusdz::value::vector3f,_std::allocator<tinyusdz::value::vector3f>_>
                                                  ::~vector((
                                                  vector<tinyusdz::value::vector3f,_std::allocator<tinyusdz::value::vector3f>_>
                                                  *)&v0_58);
                                                  Value::operator=((Value *)&v0,
                                                                   (
                                                  vector<tinyusdz::value::vector3f,_std::allocator<tinyusdz::value::vector3f>_>
                                                  *)local_cc0);
                                                  result.v_.vtable._3_1_ = 1;
                                                  }
                                                  ::std::
                                                  vector<tinyusdz::value::vector3f,_std::allocator<tinyusdz::value::vector3f>_>
                                                  ::~vector((
                                                  vector<tinyusdz::value::vector3f,_std::allocator<tinyusdz::value::vector3f>_>
                                                  *)local_cc0);
                                                  }
                                                  else {
                                                    uVar4 = TypeTraits<tinyusdz::value::vector3d>::
                                                            type_id();
                                                    uVar3 = result.v_.vtable._4_4_;
                                                    if (uVar2 == uVar4) {
                                                      a_45 = Value::as<tinyusdz::value::vector3d>
                                                                       (a,false);
                                                      c_58.z = (double)Value::
                                                  as<tinyusdz::value::vector3d>(b,false);
                                                  if ((a_45 != (vector3d *)0x0) &&
                                                     ((vector3d *)c_58.z != (vector3d *)0x0)) {
                                                    lerp<tinyusdz::value::vector3d>
                                                              ((vector3d *)&v0_59,a_45,
                                                               (vector3d *)c_58.z,dt);
                                                    local_d00 = (undefined1  [8])v0_59;
                                                    c_58.x = local_d10;
                                                    c_58.y = local_d08;
                                                    Value::operator=((Value *)&v0,
                                                                     (vector3d *)local_d00);
                                                    result.v_.vtable._3_1_ = 1;
                                                  }
                                                  }
                                                  else {
                                                    uVar4 = 
                                                  TypeTraits<std::vector<tinyusdz::value::vector3d,_std::allocator<tinyusdz::value::vector3d>_>_>
                                                  ::type_id();
                                                  uVar2 = result.v_.vtable._4_4_;
                                                  if (uVar3 == uVar4) {
                                                    a_46 = Value::
                                                  as<std::vector<tinyusdz::value::vector3d,std::allocator<tinyusdz::value::vector3d>>>
                                                            (a,false);
                                                  c_59.
                                                  super__Vector_base<tinyusdz::value::vector3d,_std::allocator<tinyusdz::value::vector3d>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                       = (pointer)Value::
                                                  as<std::vector<tinyusdz::value::vector3d,std::allocator<tinyusdz::value::vector3d>>>
                                                            (b,false);
                                                  ::std::
                                                  vector<tinyusdz::value::vector3d,_std::allocator<tinyusdz::value::vector3d>_>
                                                  ::vector((
                                                  vector<tinyusdz::value::vector3d,_std::allocator<tinyusdz::value::vector3d>_>
                                                  *)local_d40);
                                                  if ((a_46 != (
                                                  vector<tinyusdz::value::vector3d,_std::allocator<tinyusdz::value::vector3d>_>
                                                  *)0x0) && (c_59.
                                                  super__Vector_base<tinyusdz::value::vector3d,_std::allocator<tinyusdz::value::vector3d>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  != (pointer)0x0)) {
                                                    lerp<tinyusdz::value::vector3d>
                                                              ((
                                                  vector<tinyusdz::value::vector3d,_std::allocator<tinyusdz::value::vector3d>_>
                                                  *)&v0_60,a_46,
                                                  (
                                                  vector<tinyusdz::value::vector3d,_std::allocator<tinyusdz::value::vector3d>_>
                                                  *)c_59.
                                                  super__Vector_base<tinyusdz::value::vector3d,_std::allocator<tinyusdz::value::vector3d>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  ,dt);
                                                  ::std::
                                                  vector<tinyusdz::value::vector3d,_std::allocator<tinyusdz::value::vector3d>_>
                                                  ::operator=((
                                                  vector<tinyusdz::value::vector3d,_std::allocator<tinyusdz::value::vector3d>_>
                                                  *)local_d40,
                                                  (
                                                  vector<tinyusdz::value::vector3d,_std::allocator<tinyusdz::value::vector3d>_>
                                                  *)&v0_60);
                                                  ::std::
                                                  vector<tinyusdz::value::vector3d,_std::allocator<tinyusdz::value::vector3d>_>
                                                  ::~vector((
                                                  vector<tinyusdz::value::vector3d,_std::allocator<tinyusdz::value::vector3d>_>
                                                  *)&v0_60);
                                                  Value::operator=((Value *)&v0,
                                                                   (
                                                  vector<tinyusdz::value::vector3d,_std::allocator<tinyusdz::value::vector3d>_>
                                                  *)local_d40);
                                                  result.v_.vtable._3_1_ = 1;
                                                  }
                                                  ::std::
                                                  vector<tinyusdz::value::vector3d,_std::allocator<tinyusdz::value::vector3d>_>
                                                  ::~vector((
                                                  vector<tinyusdz::value::vector3d,_std::allocator<tinyusdz::value::vector3d>_>
                                                  *)local_d40);
                                                  }
                                                  else {
                                                    uVar4 = TypeTraits<tinyusdz::value::texcoord2h>
                                                            ::type_id();
                                                    uVar3 = result.v_.vtable._4_4_;
                                                    if (uVar2 == uVar4) {
                                                      a_47 = Value::as<tinyusdz::value::texcoord2h>
                                                                       (a,false);
                                                      ptStack_d68 = Value::
                                                  as<tinyusdz::value::texcoord2h>(b,false);
                                                  if ((a_47 != (texcoord2h *)0x0) &&
                                                     (ptStack_d68 != (texcoord2h *)0x0)) {
                                                    v0_61._0_4_ = lerp<tinyusdz::value::texcoord2h>
                                                                            (a_47,ptStack_d68,dt);
                                                    v0_61._4_4_ = v0_61._0_4_;
                                                    Value::operator=((Value *)&v0,
                                                                     (texcoord2h *)
                                                                     ((long)&v0_61 + 4));
                                                    result.v_.vtable._3_1_ = 1;
                                                  }
                                                  }
                                                  else {
                                                    uVar4 = 
                                                  TypeTraits<std::vector<tinyusdz::value::texcoord2h,_std::allocator<tinyusdz::value::texcoord2h>_>_>
                                                  ::type_id();
                                                  uVar2 = result.v_.vtable._4_4_;
                                                  if (uVar3 == uVar4) {
                                                    a_48 = Value::
                                                  as<std::vector<tinyusdz::value::texcoord2h,std::allocator<tinyusdz::value::texcoord2h>>>
                                                            (a,false);
                                                  c_61.
                                                  super__Vector_base<tinyusdz::value::texcoord2h,_std::allocator<tinyusdz::value::texcoord2h>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                       = (pointer)Value::
                                                  as<std::vector<tinyusdz::value::texcoord2h,std::allocator<tinyusdz::value::texcoord2h>>>
                                                            (b,false);
                                                  ::std::
                                                  vector<tinyusdz::value::texcoord2h,_std::allocator<tinyusdz::value::texcoord2h>_>
                                                  ::vector((
                                                  vector<tinyusdz::value::texcoord2h,_std::allocator<tinyusdz::value::texcoord2h>_>
                                                  *)local_d98);
                                                  if ((a_48 != (
                                                  vector<tinyusdz::value::texcoord2h,_std::allocator<tinyusdz::value::texcoord2h>_>
                                                  *)0x0) && (c_61.
                                                  super__Vector_base<tinyusdz::value::texcoord2h,_std::allocator<tinyusdz::value::texcoord2h>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  != (pointer)0x0)) {
                                                    lerp<tinyusdz::value::texcoord2h>
                                                              ((
                                                  vector<tinyusdz::value::texcoord2h,_std::allocator<tinyusdz::value::texcoord2h>_>
                                                  *)&v0_62,a_48,
                                                  (
                                                  vector<tinyusdz::value::texcoord2h,_std::allocator<tinyusdz::value::texcoord2h>_>
                                                  *)c_61.
                                                  super__Vector_base<tinyusdz::value::texcoord2h,_std::allocator<tinyusdz::value::texcoord2h>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  ,dt);
                                                  ::std::
                                                  vector<tinyusdz::value::texcoord2h,_std::allocator<tinyusdz::value::texcoord2h>_>
                                                  ::operator=((
                                                  vector<tinyusdz::value::texcoord2h,_std::allocator<tinyusdz::value::texcoord2h>_>
                                                  *)local_d98,
                                                  (
                                                  vector<tinyusdz::value::texcoord2h,_std::allocator<tinyusdz::value::texcoord2h>_>
                                                  *)&v0_62);
                                                  ::std::
                                                  vector<tinyusdz::value::texcoord2h,_std::allocator<tinyusdz::value::texcoord2h>_>
                                                  ::~vector((
                                                  vector<tinyusdz::value::texcoord2h,_std::allocator<tinyusdz::value::texcoord2h>_>
                                                  *)&v0_62);
                                                  Value::operator=((Value *)&v0,
                                                                   (
                                                  vector<tinyusdz::value::texcoord2h,_std::allocator<tinyusdz::value::texcoord2h>_>
                                                  *)local_d98);
                                                  result.v_.vtable._3_1_ = 1;
                                                  }
                                                  ::std::
                                                  vector<tinyusdz::value::texcoord2h,_std::allocator<tinyusdz::value::texcoord2h>_>
                                                  ::~vector((
                                                  vector<tinyusdz::value::texcoord2h,_std::allocator<tinyusdz::value::texcoord2h>_>
                                                  *)local_d98);
                                                  }
                                                  else {
                                                    uVar4 = TypeTraits<tinyusdz::value::texcoord2f>
                                                            ::type_id();
                                                    uVar3 = result.v_.vtable._4_4_;
                                                    if (uVar2 == uVar4) {
                                                      a_49 = Value::as<tinyusdz::value::texcoord2f>
                                                                       (a,false);
                                                      c_62 = (texcoord2f)
                                                             Value::as<tinyusdz::value::texcoord2f>
                                                                       (b,false);
                                                      if ((a_49 != (texcoord2f *)0x0) &&
                                                         (c_62 != (texcoord2f)0x0)) {
                                                        local_dc8 = 
                                                  lerp<tinyusdz::value::texcoord2f>
                                                            (a_49,(texcoord2f *)c_62,dt);
                                                  Value::operator=((Value *)&v0,&local_dc8);
                                                  result.v_.vtable._3_1_ = 1;
                                                  }
                                                  }
                                                  else {
                                                    uVar4 = 
                                                  TypeTraits<std::vector<tinyusdz::value::texcoord2f,_std::allocator<tinyusdz::value::texcoord2f>_>_>
                                                  ::type_id();
                                                  uVar2 = result.v_.vtable._4_4_;
                                                  if (uVar3 == uVar4) {
                                                    a_50 = Value::
                                                  as<std::vector<tinyusdz::value::texcoord2f,std::allocator<tinyusdz::value::texcoord2f>>>
                                                            (a,false);
                                                  c_63.
                                                  super__Vector_base<tinyusdz::value::texcoord2f,_std::allocator<tinyusdz::value::texcoord2f>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                       = (pointer)Value::
                                                  as<std::vector<tinyusdz::value::texcoord2f,std::allocator<tinyusdz::value::texcoord2f>>>
                                                            (b,false);
                                                  ::std::
                                                  vector<tinyusdz::value::texcoord2f,_std::allocator<tinyusdz::value::texcoord2f>_>
                                                  ::vector((
                                                  vector<tinyusdz::value::texcoord2f,_std::allocator<tinyusdz::value::texcoord2f>_>
                                                  *)local_df8);
                                                  if ((a_50 != (
                                                  vector<tinyusdz::value::texcoord2f,_std::allocator<tinyusdz::value::texcoord2f>_>
                                                  *)0x0) && (c_63.
                                                  super__Vector_base<tinyusdz::value::texcoord2f,_std::allocator<tinyusdz::value::texcoord2f>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  != (pointer)0x0)) {
                                                    lerp<tinyusdz::value::texcoord2f>
                                                              ((
                                                  vector<tinyusdz::value::texcoord2f,_std::allocator<tinyusdz::value::texcoord2f>_>
                                                  *)&v0_64,a_50,
                                                  (
                                                  vector<tinyusdz::value::texcoord2f,_std::allocator<tinyusdz::value::texcoord2f>_>
                                                  *)c_63.
                                                  super__Vector_base<tinyusdz::value::texcoord2f,_std::allocator<tinyusdz::value::texcoord2f>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  ,dt);
                                                  ::std::
                                                  vector<tinyusdz::value::texcoord2f,_std::allocator<tinyusdz::value::texcoord2f>_>
                                                  ::operator=((
                                                  vector<tinyusdz::value::texcoord2f,_std::allocator<tinyusdz::value::texcoord2f>_>
                                                  *)local_df8,
                                                  (
                                                  vector<tinyusdz::value::texcoord2f,_std::allocator<tinyusdz::value::texcoord2f>_>
                                                  *)&v0_64);
                                                  ::std::
                                                  vector<tinyusdz::value::texcoord2f,_std::allocator<tinyusdz::value::texcoord2f>_>
                                                  ::~vector((
                                                  vector<tinyusdz::value::texcoord2f,_std::allocator<tinyusdz::value::texcoord2f>_>
                                                  *)&v0_64);
                                                  Value::operator=((Value *)&v0,
                                                                   (
                                                  vector<tinyusdz::value::texcoord2f,_std::allocator<tinyusdz::value::texcoord2f>_>
                                                  *)local_df8);
                                                  result.v_.vtable._3_1_ = 1;
                                                  }
                                                  ::std::
                                                  vector<tinyusdz::value::texcoord2f,_std::allocator<tinyusdz::value::texcoord2f>_>
                                                  ::~vector((
                                                  vector<tinyusdz::value::texcoord2f,_std::allocator<tinyusdz::value::texcoord2f>_>
                                                  *)local_df8);
                                                  }
                                                  else {
                                                    uVar4 = TypeTraits<tinyusdz::value::texcoord2d>
                                                            ::type_id();
                                                    uVar3 = result.v_.vtable._4_4_;
                                                    if (uVar2 == uVar4) {
                                                      a_51 = Value::as<tinyusdz::value::texcoord2d>
                                                                       (a,false);
                                                      c_64.t = (double)Value::
                                                  as<tinyusdz::value::texcoord2d>(b,false);
                                                  if ((a_51 != (texcoord2d *)0x0) &&
                                                     ((texcoord2d *)c_64.t != (texcoord2d *)0x0)) {
                                                    tVar22 = lerp<tinyusdz::value::texcoord2d>
                                                                       (a_51,(texcoord2d *)c_64.t,dt
                                                                       );
                                                    v0_65 = (
                                                  vector<tinyusdz::value::texcoord2d,_std::allocator<tinyusdz::value::texcoord2d>_>
                                                  *)tVar22.s;
                                                  local_e30 = (undefined1  [8])v0_65;
                                                  local_e38 = tVar22.t;
                                                  c_64.s = local_e38;
                                                  Value::operator=((Value *)&v0,
                                                                   (texcoord2d *)local_e30);
                                                  result.v_.vtable._3_1_ = 1;
                                                  }
                                                  }
                                                  else {
                                                    uVar4 = 
                                                  TypeTraits<std::vector<tinyusdz::value::texcoord2d,_std::allocator<tinyusdz::value::texcoord2d>_>_>
                                                  ::type_id();
                                                  uVar2 = result.v_.vtable._4_4_;
                                                  if (uVar3 == uVar4) {
                                                    a_52 = Value::
                                                  as<std::vector<tinyusdz::value::texcoord2d,std::allocator<tinyusdz::value::texcoord2d>>>
                                                            (a,false);
                                                  c_65.
                                                  super__Vector_base<tinyusdz::value::texcoord2d,_std::allocator<tinyusdz::value::texcoord2d>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                       = (pointer)Value::
                                                  as<std::vector<tinyusdz::value::texcoord2d,std::allocator<tinyusdz::value::texcoord2d>>>
                                                            (b,false);
                                                  ::std::
                                                  vector<tinyusdz::value::texcoord2d,_std::allocator<tinyusdz::value::texcoord2d>_>
                                                  ::vector((
                                                  vector<tinyusdz::value::texcoord2d,_std::allocator<tinyusdz::value::texcoord2d>_>
                                                  *)local_e68);
                                                  if ((a_52 != (
                                                  vector<tinyusdz::value::texcoord2d,_std::allocator<tinyusdz::value::texcoord2d>_>
                                                  *)0x0) && (c_65.
                                                  super__Vector_base<tinyusdz::value::texcoord2d,_std::allocator<tinyusdz::value::texcoord2d>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  != (pointer)0x0)) {
                                                    lerp<tinyusdz::value::texcoord2d>
                                                              ((
                                                  vector<tinyusdz::value::texcoord2d,_std::allocator<tinyusdz::value::texcoord2d>_>
                                                  *)&v0_66,a_52,
                                                  (
                                                  vector<tinyusdz::value::texcoord2d,_std::allocator<tinyusdz::value::texcoord2d>_>
                                                  *)c_65.
                                                  super__Vector_base<tinyusdz::value::texcoord2d,_std::allocator<tinyusdz::value::texcoord2d>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  ,dt);
                                                  ::std::
                                                  vector<tinyusdz::value::texcoord2d,_std::allocator<tinyusdz::value::texcoord2d>_>
                                                  ::operator=((
                                                  vector<tinyusdz::value::texcoord2d,_std::allocator<tinyusdz::value::texcoord2d>_>
                                                  *)local_e68,
                                                  (
                                                  vector<tinyusdz::value::texcoord2d,_std::allocator<tinyusdz::value::texcoord2d>_>
                                                  *)&v0_66);
                                                  ::std::
                                                  vector<tinyusdz::value::texcoord2d,_std::allocator<tinyusdz::value::texcoord2d>_>
                                                  ::~vector((
                                                  vector<tinyusdz::value::texcoord2d,_std::allocator<tinyusdz::value::texcoord2d>_>
                                                  *)&v0_66);
                                                  Value::operator=((Value *)&v0,
                                                                   (
                                                  vector<tinyusdz::value::texcoord2d,_std::allocator<tinyusdz::value::texcoord2d>_>
                                                  *)local_e68);
                                                  result.v_.vtable._3_1_ = 1;
                                                  }
                                                  ::std::
                                                  vector<tinyusdz::value::texcoord2d,_std::allocator<tinyusdz::value::texcoord2d>_>
                                                  ::~vector((
                                                  vector<tinyusdz::value::texcoord2d,_std::allocator<tinyusdz::value::texcoord2d>_>
                                                  *)local_e68);
                                                  }
                                                  else {
                                                    uVar4 = TypeTraits<tinyusdz::value::texcoord3h>
                                                            ::type_id();
                                                    uVar3 = result.v_.vtable._4_4_;
                                                    if (uVar2 == uVar4) {
                                                      a_53 = Value::as<tinyusdz::value::texcoord3h>
                                                                       (a,false);
                                                      ptStack_e90 = Value::
                                                  as<tinyusdz::value::texcoord3h>(b,false);
                                                  if ((a_53 != (texcoord3h *)0x0) &&
                                                     (ptStack_e90 != (texcoord3h *)0x0)) {
                                                    tVar10 = lerp<tinyusdz::value::texcoord3h>
                                                                       (a_53,ptStack_e90,dt);
                                                    local_e96._0_4_ = tVar10._0_4_;
                                                    local_e96.r = tVar10.r.value;
                                                    Value::operator=((Value *)&v0,&local_e96);
                                                    result.v_.vtable._3_1_ = 1;
                                                  }
                                                  }
                                                  else {
                                                    uVar4 = 
                                                  TypeTraits<std::vector<tinyusdz::value::texcoord3h,_std::allocator<tinyusdz::value::texcoord3h>_>_>
                                                  ::type_id();
                                                  uVar2 = result.v_.vtable._4_4_;
                                                  if (uVar3 == uVar4) {
                                                    a_54 = Value::
                                                  as<std::vector<tinyusdz::value::texcoord3h,std::allocator<tinyusdz::value::texcoord3h>>>
                                                            (a,false);
                                                  c_67.
                                                  super__Vector_base<tinyusdz::value::texcoord3h,_std::allocator<tinyusdz::value::texcoord3h>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                       = (pointer)Value::
                                                  as<std::vector<tinyusdz::value::texcoord3h,std::allocator<tinyusdz::value::texcoord3h>>>
                                                            (b,false);
                                                  ::std::
                                                  vector<tinyusdz::value::texcoord3h,_std::allocator<tinyusdz::value::texcoord3h>_>
                                                  ::vector((
                                                  vector<tinyusdz::value::texcoord3h,_std::allocator<tinyusdz::value::texcoord3h>_>
                                                  *)local_ec8);
                                                  if ((a_54 != (
                                                  vector<tinyusdz::value::texcoord3h,_std::allocator<tinyusdz::value::texcoord3h>_>
                                                  *)0x0) && (c_67.
                                                  super__Vector_base<tinyusdz::value::texcoord3h,_std::allocator<tinyusdz::value::texcoord3h>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  != (pointer)0x0)) {
                                                    lerp<tinyusdz::value::texcoord3h>
                                                              ((
                                                  vector<tinyusdz::value::texcoord3h,_std::allocator<tinyusdz::value::texcoord3h>_>
                                                  *)&v0_68,a_54,
                                                  (
                                                  vector<tinyusdz::value::texcoord3h,_std::allocator<tinyusdz::value::texcoord3h>_>
                                                  *)c_67.
                                                  super__Vector_base<tinyusdz::value::texcoord3h,_std::allocator<tinyusdz::value::texcoord3h>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  ,dt);
                                                  ::std::
                                                  vector<tinyusdz::value::texcoord3h,_std::allocator<tinyusdz::value::texcoord3h>_>
                                                  ::operator=((
                                                  vector<tinyusdz::value::texcoord3h,_std::allocator<tinyusdz::value::texcoord3h>_>
                                                  *)local_ec8,
                                                  (
                                                  vector<tinyusdz::value::texcoord3h,_std::allocator<tinyusdz::value::texcoord3h>_>
                                                  *)&v0_68);
                                                  ::std::
                                                  vector<tinyusdz::value::texcoord3h,_std::allocator<tinyusdz::value::texcoord3h>_>
                                                  ::~vector((
                                                  vector<tinyusdz::value::texcoord3h,_std::allocator<tinyusdz::value::texcoord3h>_>
                                                  *)&v0_68);
                                                  Value::operator=((Value *)&v0,
                                                                   (
                                                  vector<tinyusdz::value::texcoord3h,_std::allocator<tinyusdz::value::texcoord3h>_>
                                                  *)local_ec8);
                                                  result.v_.vtable._3_1_ = 1;
                                                  }
                                                  ::std::
                                                  vector<tinyusdz::value::texcoord3h,_std::allocator<tinyusdz::value::texcoord3h>_>
                                                  ::~vector((
                                                  vector<tinyusdz::value::texcoord3h,_std::allocator<tinyusdz::value::texcoord3h>_>
                                                  *)local_ec8);
                                                  }
                                                  else {
                                                    uVar4 = TypeTraits<tinyusdz::value::texcoord3f>
                                                            ::type_id();
                                                    uVar3 = result.v_.vtable._4_4_;
                                                    if (uVar2 == uVar4) {
                                                      a_55 = Value::as<tinyusdz::value::texcoord3f>
                                                                       (a,false);
                                                      c_68._4_8_ = Value::
                                                  as<tinyusdz::value::texcoord3f>(b,false);
                                                  if ((a_55 != (texcoord3f *)0x0) &&
                                                     ((texcoord3f *)c_68._4_8_ != (texcoord3f *)0x0)
                                                     ) {
                                                    tVar17 = lerp<tinyusdz::value::texcoord3f>
                                                                       (a_55,(texcoord3f *)
                                                                             c_68._4_8_,dt);
                                                    v0_69 = tVar17._0_8_;
                                                    local_f10 = tVar17.r;
                                                    local_efc = v0_69;
                                                    c_68.s = local_f10;
                                                    Value::operator=((Value *)&v0,
                                                                     (texcoord3f *)&local_efc);
                                                    result.v_.vtable._3_1_ = 1;
                                                  }
                                                  }
                                                  else {
                                                    uVar4 = 
                                                  TypeTraits<std::vector<tinyusdz::value::texcoord3f,_std::allocator<tinyusdz::value::texcoord3f>_>_>
                                                  ::type_id();
                                                  uVar2 = result.v_.vtable._4_4_;
                                                  if (uVar3 == uVar4) {
                                                    a_56 = Value::
                                                  as<std::vector<tinyusdz::value::texcoord3f,std::allocator<tinyusdz::value::texcoord3f>>>
                                                            (a,false);
                                                  c_69.
                                                  super__Vector_base<tinyusdz::value::texcoord3f,_std::allocator<tinyusdz::value::texcoord3f>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                       = (pointer)Value::
                                                  as<std::vector<tinyusdz::value::texcoord3f,std::allocator<tinyusdz::value::texcoord3f>>>
                                                            (b,false);
                                                  ::std::
                                                  vector<tinyusdz::value::texcoord3f,_std::allocator<tinyusdz::value::texcoord3f>_>
                                                  ::vector((
                                                  vector<tinyusdz::value::texcoord3f,_std::allocator<tinyusdz::value::texcoord3f>_>
                                                  *)local_f40);
                                                  if ((a_56 != (
                                                  vector<tinyusdz::value::texcoord3f,_std::allocator<tinyusdz::value::texcoord3f>_>
                                                  *)0x0) && (c_69.
                                                  super__Vector_base<tinyusdz::value::texcoord3f,_std::allocator<tinyusdz::value::texcoord3f>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  != (pointer)0x0)) {
                                                    lerp<tinyusdz::value::texcoord3f>
                                                              ((
                                                  vector<tinyusdz::value::texcoord3f,_std::allocator<tinyusdz::value::texcoord3f>_>
                                                  *)&v0_70,a_56,
                                                  (
                                                  vector<tinyusdz::value::texcoord3f,_std::allocator<tinyusdz::value::texcoord3f>_>
                                                  *)c_69.
                                                  super__Vector_base<tinyusdz::value::texcoord3f,_std::allocator<tinyusdz::value::texcoord3f>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  ,dt);
                                                  ::std::
                                                  vector<tinyusdz::value::texcoord3f,_std::allocator<tinyusdz::value::texcoord3f>_>
                                                  ::operator=((
                                                  vector<tinyusdz::value::texcoord3f,_std::allocator<tinyusdz::value::texcoord3f>_>
                                                  *)local_f40,
                                                  (
                                                  vector<tinyusdz::value::texcoord3f,_std::allocator<tinyusdz::value::texcoord3f>_>
                                                  *)&v0_70);
                                                  ::std::
                                                  vector<tinyusdz::value::texcoord3f,_std::allocator<tinyusdz::value::texcoord3f>_>
                                                  ::~vector((
                                                  vector<tinyusdz::value::texcoord3f,_std::allocator<tinyusdz::value::texcoord3f>_>
                                                  *)&v0_70);
                                                  Value::operator=((Value *)&v0,
                                                                   (
                                                  vector<tinyusdz::value::texcoord3f,_std::allocator<tinyusdz::value::texcoord3f>_>
                                                  *)local_f40);
                                                  result.v_.vtable._3_1_ = 1;
                                                  }
                                                  ::std::
                                                  vector<tinyusdz::value::texcoord3f,_std::allocator<tinyusdz::value::texcoord3f>_>
                                                  ::~vector((
                                                  vector<tinyusdz::value::texcoord3f,_std::allocator<tinyusdz::value::texcoord3f>_>
                                                  *)local_f40);
                                                  }
                                                  else {
                                                    uVar4 = TypeTraits<tinyusdz::value::texcoord3d>
                                                            ::type_id();
                                                    uVar3 = result.v_.vtable._4_4_;
                                                    if (uVar2 == uVar4) {
                                                      a_57 = Value::as<tinyusdz::value::texcoord3d>
                                                                       (a,false);
                                                      c_70.r = (double)Value::
                                                  as<tinyusdz::value::texcoord3d>(b,false);
                                                  if ((a_57 != (texcoord3d *)0x0) &&
                                                     ((texcoord3d *)c_70.r != (texcoord3d *)0x0)) {
                                                    lerp<tinyusdz::value::texcoord3d>
                                                              ((texcoord3d *)&v0_71,a_57,
                                                               (texcoord3d *)c_70.r,dt);
                                                    local_f80 = (undefined1  [8])v0_71;
                                                    c_70.s = local_f90;
                                                    c_70.t = local_f88;
                                                    Value::operator=((Value *)&v0,
                                                                     (texcoord3d *)local_f80);
                                                    result.v_.vtable._3_1_ = 1;
                                                  }
                                                  }
                                                  else {
                                                    uVar2 = 
                                                  TypeTraits<std::vector<tinyusdz::value::texcoord3d,_std::allocator<tinyusdz::value::texcoord3d>_>_>
                                                  ::type_id();
                                                  if (uVar3 == uVar2) {
                                                    a_58 = Value::
                                                  as<std::vector<tinyusdz::value::texcoord3d,std::allocator<tinyusdz::value::texcoord3d>>>
                                                            (a,false);
                                                  c_71.
                                                  super__Vector_base<tinyusdz::value::texcoord3d,_std::allocator<tinyusdz::value::texcoord3d>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                       = (pointer)Value::
                                                  as<std::vector<tinyusdz::value::texcoord3d,std::allocator<tinyusdz::value::texcoord3d>>>
                                                            (b,false);
                                                  ::std::
                                                  vector<tinyusdz::value::texcoord3d,_std::allocator<tinyusdz::value::texcoord3d>_>
                                                  ::vector((
                                                  vector<tinyusdz::value::texcoord3d,_std::allocator<tinyusdz::value::texcoord3d>_>
                                                  *)local_fc0);
                                                  if ((a_58 != (
                                                  vector<tinyusdz::value::texcoord3d,_std::allocator<tinyusdz::value::texcoord3d>_>
                                                  *)0x0) && (c_71.
                                                  super__Vector_base<tinyusdz::value::texcoord3d,_std::allocator<tinyusdz::value::texcoord3d>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  != (pointer)0x0)) {
                                                    lerp<tinyusdz::value::texcoord3d>
                                                              (&local_fd8,a_58,
                                                               (
                                                  vector<tinyusdz::value::texcoord3d,_std::allocator<tinyusdz::value::texcoord3d>_>
                                                  *)c_71.
                                                  super__Vector_base<tinyusdz::value::texcoord3d,_std::allocator<tinyusdz::value::texcoord3d>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  ,dt);
                                                  ::std::
                                                  vector<tinyusdz::value::texcoord3d,_std::allocator<tinyusdz::value::texcoord3d>_>
                                                  ::operator=((
                                                  vector<tinyusdz::value::texcoord3d,_std::allocator<tinyusdz::value::texcoord3d>_>
                                                  *)local_fc0,&local_fd8);
                                                  ::std::
                                                  vector<tinyusdz::value::texcoord3d,_std::allocator<tinyusdz::value::texcoord3d>_>
                                                  ::~vector(&local_fd8);
                                                  Value::operator=((Value *)&v0,
                                                                   (
                                                  vector<tinyusdz::value::texcoord3d,_std::allocator<tinyusdz::value::texcoord3d>_>
                                                  *)local_fc0);
                                                  result.v_.vtable._3_1_ = 1;
                                                  }
                                                  ::std::
                                                  vector<tinyusdz::value::texcoord3d,_std::allocator<tinyusdz::value::texcoord3d>_>
                                                  ::~vector((
                                                  vector<tinyusdz::value::texcoord3d,_std::allocator<tinyusdz::value::texcoord3d>_>
                                                  *)local_fc0);
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                }
                                              }
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
        if ((result.v_.vtable._3_1_ & 1) != 0) {
          Value::operator=(dst,(Value *)&v0);
        }
        a_local._7_1_ = (bool)(result.v_.vtable._3_1_ & 1);
        Value::~Value((Value *)&v0);
      }
      else {
        a_local._7_1_ = false;
      }
    }
    else {
      a_local._7_1_ = false;
    }
  }
  return a_local._7_1_;
}

Assistant:

bool Lerp(const value::Value &a, const value::Value &b, double dt, value::Value *dst) {
  if (!dst) {
    return false;
  }

  if (a.type_id() != b.type_id()) {
    return false;
  }

  uint32_t tyid = a.type_id();

  if (!IsLerpSupportedType(tyid)) {
    return false;
  }

  bool ok{false};
  value::Value result;

#define DO_LERP(__ty) \
  if (tyid == value::TypeTraits<__ty>::type_id()) { \
    const __ty *v0 = a.as<__ty>(); \
    const __ty *v1 = b.as<__ty>(); \
    __ty c; \
    if (v0 && v1) { \
      c = lerp(*v0, *v1, dt); \
      result = c; \
      ok = true; \
    } \
  } else if (tyid == value::TypeTraits<std::vector<__ty>>::type_id()) { \
    const std::vector<__ty> *v0 = a.as<std::vector<__ty>>(); \
    const std::vector<__ty> *v1 = b.as<std::vector<__ty>>(); \
    std::vector<__ty> c; \
    if (v0 && v1) { \
      c = lerp(*v0, *v1, dt); \
      result = c; \
      ok = true; \
    } \
  } else

  DO_LERP(value::half)
  DO_LERP(value::half2)
  DO_LERP(value::half3)
  DO_LERP(value::half4)
  DO_LERP(float)
  DO_LERP(value::float2)
  DO_LERP(value::float3)
  DO_LERP(value::float4)
  DO_LERP(double)
  DO_LERP(value::double2)
  DO_LERP(value::double3)
  DO_LERP(value::double4)
  DO_LERP(value::quath)
  DO_LERP(value::quatf)
  DO_LERP(value::quatd)
  DO_LERP(value::color3h)
  DO_LERP(value::color3f)
  DO_LERP(value::color3d)
  DO_LERP(value::color4h)
  DO_LERP(value::color4f)
  DO_LERP(value::color4d)
  DO_LERP(value::point3h)
  DO_LERP(value::point3f)
  DO_LERP(value::point3d)
  DO_LERP(value::normal3h)
  DO_LERP(value::normal3f)
  DO_LERP(value::normal3d)
  DO_LERP(value::vector3h)
  DO_LERP(value::vector3f)
  DO_LERP(value::vector3d)
  DO_LERP(value::texcoord2h)
  DO_LERP(value::texcoord2f)
  DO_LERP(value::texcoord2d)
  DO_LERP(value::texcoord3h)
  DO_LERP(value::texcoord3f)
  DO_LERP(value::texcoord3d)
  {
    DCOUT("TODO: type " << GetTypeName(tyid));
  }

#undef DO_LERP

  if (ok) {
    (*dst) = result;
  }

  return ok;
}